

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_blur_geometry_device.cpp
# Opt level: O0

uint embree::addTriangleCube(RTCScene scene,Vec3fa *pos,uint num_time_steps)

{
  ulong *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  float __x;
  uint uVar5;
  long lVar6;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  uint geomID;
  Vec3fa v;
  int i;
  AffineSpace3fa scale;
  AffineSpace3fa rotation;
  Vec3fa *vertices;
  RTCBufferType bufType;
  uint t;
  RTCGeometry geom;
  __m128 mask;
  Scalar c;
  Scalar s;
  Vector u;
  __m128 c_2;
  __m128 r;
  __m128 a_1;
  vfloat4 c_1;
  vfloat4 b;
  vfloat4 a;
  undefined8 local_43a8;
  undefined8 uStack_43a0;
  undefined8 local_4398;
  undefined8 uStack_4390;
  undefined8 local_4388;
  undefined8 uStack_4380;
  undefined8 local_4378;
  undefined8 uStack_4370;
  undefined8 local_4368;
  undefined8 uStack_4360;
  undefined8 local_4358;
  undefined8 uStack_4350;
  undefined8 local_4348;
  undefined8 uStack_4340;
  undefined8 local_4338;
  undefined8 uStack_4330;
  undefined8 local_4328;
  undefined8 uStack_4320;
  undefined8 local_4318;
  undefined8 uStack_4310;
  undefined8 local_4308;
  undefined8 uStack_4300;
  undefined8 local_42f8;
  undefined8 uStack_42f0;
  undefined8 local_42e8;
  undefined8 uStack_42e0;
  undefined8 local_42d8;
  undefined8 uStack_42d0;
  undefined8 local_42c8;
  undefined8 uStack_42c0;
  undefined8 local_42b8;
  undefined8 uStack_42b0;
  undefined8 local_42a8;
  undefined8 uStack_42a0;
  undefined8 local_4298;
  undefined8 uStack_4290;
  undefined8 local_4288;
  ulong uStack_4280;
  int local_426c;
  undefined8 local_4268;
  undefined8 uStack_4260;
  undefined8 local_4258;
  undefined8 uStack_4250;
  undefined8 local_4248;
  undefined8 uStack_4240;
  undefined8 local_4238;
  undefined8 uStack_4230;
  undefined8 local_4228;
  undefined8 uStack_4220;
  float local_420c;
  undefined8 local_4208;
  undefined8 uStack_4200;
  ulong local_41f8 [3];
  undefined8 uStack_41e0;
  undefined8 local_41d8;
  undefined8 uStack_41d0;
  undefined8 local_41c8;
  undefined8 uStack_41c0;
  undefined8 local_41b8;
  undefined8 uStack_41b0;
  long local_41a8;
  undefined4 local_41a0;
  uint local_419c;
  undefined8 local_4198;
  uint local_418c;
  undefined8 *local_4188;
  undefined8 local_4180;
  ulong local_4178;
  ulong uStack_4170;
  undefined8 local_4168;
  undefined8 uStack_4160;
  undefined8 local_4158;
  undefined8 uStack_4150;
  undefined8 local_4148;
  undefined8 uStack_4140;
  undefined8 local_4138;
  ulong uStack_4130;
  undefined8 local_4128;
  ulong uStack_4120;
  undefined8 local_4118;
  ulong uStack_4110;
  undefined8 local_4108;
  ulong uStack_4100;
  undefined8 local_40f8;
  undefined8 uStack_40f0;
  undefined8 local_40e8;
  undefined8 uStack_40e0;
  undefined8 local_40d8;
  undefined8 uStack_40d0;
  undefined8 local_40c8;
  undefined8 uStack_40c0;
  undefined8 local_40b8;
  undefined8 uStack_40b0;
  undefined8 local_40a8;
  undefined8 uStack_40a0;
  undefined8 local_4098;
  undefined8 uStack_4090;
  undefined8 local_4088;
  undefined8 uStack_4080;
  undefined8 local_4078;
  undefined8 uStack_4070;
  undefined8 local_4068;
  undefined8 uStack_4060;
  float *local_4050;
  undefined8 *local_4048;
  ulong *local_4040;
  ulong *local_4038;
  undefined4 local_402c;
  undefined4 local_4028;
  undefined4 local_4024;
  ulong *local_4020;
  undefined4 local_4014;
  undefined4 local_4010;
  undefined4 local_400c;
  undefined8 *local_4008;
  undefined4 local_3ffc;
  undefined4 local_3ff8;
  undefined4 local_3ff4;
  undefined8 *local_3ff0;
  uint local_3fe4;
  undefined4 local_3fe0;
  undefined4 local_3fdc;
  undefined8 *local_3fd8;
  undefined4 local_3fcc;
  undefined4 local_3fc8;
  undefined4 local_3fc4;
  undefined8 *local_3fc0;
  undefined4 local_3fb4;
  undefined4 local_3fb0;
  undefined4 local_3fac;
  undefined8 *local_3fa8;
  undefined4 local_3f9c;
  undefined4 local_3f98;
  undefined4 local_3f94;
  undefined8 *local_3f90;
  undefined4 local_3f84;
  undefined4 local_3f80;
  undefined4 local_3f7c;
  undefined8 *local_3f78;
  undefined4 local_3f6c;
  undefined4 local_3f68;
  undefined4 local_3f64;
  undefined8 *local_3f60;
  undefined4 local_3f54;
  undefined4 local_3f50;
  undefined4 local_3f4c;
  undefined8 *local_3f48;
  undefined4 local_3f3c;
  undefined4 local_3f38;
  undefined4 local_3f34;
  undefined8 *local_3f30;
  undefined4 local_3f24;
  undefined4 local_3f20;
  undefined4 local_3f1c;
  undefined8 *local_3f18;
  undefined8 *local_3f10;
  undefined8 *local_3f08;
  undefined8 *local_3f00;
  undefined8 local_3ef8;
  undefined8 uStack_3ef0;
  undefined8 local_3ee8;
  undefined8 uStack_3ee0;
  undefined8 local_3ed8;
  undefined8 uStack_3ed0;
  undefined8 local_3ec8;
  undefined8 uStack_3ec0;
  undefined8 local_3eb8;
  undefined8 uStack_3eb0;
  undefined8 *local_3ea0;
  undefined8 *local_3e98;
  undefined8 *local_3e90;
  undefined8 *local_3e88;
  undefined8 *local_3e80;
  undefined8 *local_3e78;
  undefined8 *local_3e70;
  undefined8 *local_3e68;
  undefined8 *local_3e60;
  undefined8 *local_3e58;
  undefined8 *local_3e50;
  undefined8 *local_3e48;
  undefined8 *local_3e40;
  undefined8 *local_3e38;
  undefined8 *local_3e30;
  undefined8 *local_3e28;
  undefined8 *local_3e20;
  undefined8 *local_3e18;
  undefined8 *local_3e10;
  undefined8 *local_3e08;
  undefined8 *local_3e00;
  undefined8 *local_3df8;
  undefined8 *local_3df0;
  undefined8 *local_3de8;
  undefined8 *local_3de0;
  undefined8 *local_3dd8;
  undefined8 *local_3dd0;
  undefined8 *local_3dc8;
  undefined8 *local_3dc0;
  undefined8 local_3db8;
  undefined8 uStack_3db0;
  undefined8 local_3da8;
  undefined8 uStack_3da0;
  undefined8 local_3d98;
  undefined8 uStack_3d90;
  undefined8 *local_3d88;
  undefined8 *local_3d80;
  undefined8 local_3d78;
  undefined8 uStack_3d70;
  undefined8 local_3d68;
  undefined8 uStack_3d60;
  undefined8 local_3d58;
  undefined8 uStack_3d50;
  undefined8 local_3d48;
  undefined8 uStack_3d40;
  undefined8 local_3d38;
  undefined8 uStack_3d30;
  undefined8 *local_3d28;
  undefined8 *local_3d20;
  ulong *local_3d18;
  undefined8 *local_3d10;
  undefined8 *local_3d08;
  undefined8 *local_3d00;
  undefined8 local_3cf8;
  undefined8 uStack_3cf0;
  undefined8 local_3ce8;
  undefined8 uStack_3ce0;
  undefined8 local_3cd8;
  undefined8 uStack_3cd0;
  undefined8 local_3cc8;
  undefined8 uStack_3cc0;
  undefined8 local_3cb8;
  undefined8 uStack_3cb0;
  undefined8 *local_3ca8;
  undefined8 *local_3ca0;
  undefined8 *local_3c98;
  undefined8 *local_3c90;
  undefined8 *local_3c88;
  undefined8 *local_3c80;
  undefined8 local_3c78;
  undefined8 uStack_3c70;
  undefined8 local_3c68;
  undefined8 uStack_3c60;
  undefined8 local_3c58;
  undefined8 uStack_3c50;
  undefined8 local_3c48;
  undefined8 uStack_3c40;
  undefined8 local_3c38;
  undefined8 uStack_3c30;
  undefined8 *local_3c28;
  ulong *local_3c20;
  undefined8 *local_3c18;
  undefined8 *local_3c10;
  undefined8 *local_3c08;
  undefined8 *local_3c00;
  float local_3bf4;
  undefined8 *local_3bf0;
  float local_3be4;
  undefined8 *local_3be0;
  float local_3bd4;
  undefined8 *local_3bd0;
  undefined4 local_3bc4;
  undefined8 *local_3bc0;
  undefined4 local_3bb4;
  undefined8 *local_3bb0;
  undefined4 local_3ba4;
  undefined8 *local_3ba0;
  undefined4 local_3b94;
  undefined8 *local_3b90;
  undefined8 local_3b88;
  undefined8 uStack_3b80;
  undefined8 local_3b78;
  undefined8 uStack_3b70;
  undefined8 local_3b68;
  undefined8 uStack_3b60;
  ulong *local_3b58;
  undefined8 *local_3b50;
  undefined8 local_3b48;
  undefined8 uStack_3b40;
  undefined8 local_3b38;
  undefined8 uStack_3b30;
  undefined8 local_3b28;
  undefined8 uStack_3b20;
  undefined8 *local_3b18;
  undefined8 *local_3b10;
  undefined8 local_3b08;
  undefined8 uStack_3b00;
  undefined4 local_3af8;
  undefined4 local_3af4;
  undefined4 local_3af0;
  undefined4 local_3aec;
  undefined8 local_3ae8;
  undefined8 uStack_3ae0;
  undefined4 local_3ad8;
  undefined4 local_3ad4;
  undefined4 local_3ad0;
  undefined4 local_3acc;
  undefined8 local_3ac8;
  undefined8 uStack_3ac0;
  undefined4 local_3ab8;
  undefined4 local_3ab4;
  undefined4 local_3ab0;
  undefined4 local_3aac;
  undefined8 local_3aa8;
  undefined8 uStack_3aa0;
  undefined4 local_3a98;
  undefined4 local_3a94;
  undefined4 local_3a90;
  undefined4 local_3a8c;
  undefined8 local_3a88;
  undefined8 uStack_3a80;
  undefined4 local_3a78;
  undefined4 local_3a74;
  undefined4 local_3a70;
  undefined4 local_3a6c;
  undefined8 local_3a68;
  undefined8 uStack_3a60;
  undefined4 local_3a58;
  undefined4 local_3a54;
  undefined4 local_3a50;
  undefined4 local_3a4c;
  undefined8 local_3a48;
  undefined8 uStack_3a40;
  undefined4 local_3a38;
  undefined4 local_3a34;
  undefined4 local_3a30;
  undefined4 local_3a2c;
  undefined8 local_3a28;
  undefined8 uStack_3a20;
  undefined4 local_3a18;
  undefined4 local_3a14;
  undefined4 local_3a10;
  undefined4 local_3a0c;
  undefined8 local_3a08;
  ulong uStack_3a00;
  undefined4 local_39f8;
  undefined4 local_39f4;
  uint local_39f0;
  undefined4 local_39ec;
  undefined8 local_39e8;
  undefined8 uStack_39e0;
  undefined4 local_39d8;
  undefined4 local_39d4;
  undefined4 local_39d0;
  undefined4 local_39cc;
  undefined8 local_39c8;
  undefined8 uStack_39c0;
  undefined4 local_39b8;
  undefined4 local_39b4;
  undefined4 local_39b0;
  undefined4 local_39ac;
  undefined8 local_39a8;
  undefined8 uStack_39a0;
  undefined4 local_3998;
  undefined4 local_3994;
  undefined4 local_3990;
  undefined4 local_398c;
  undefined8 local_3988;
  undefined8 uStack_3980;
  undefined8 local_3978;
  undefined8 uStack_3970;
  undefined8 local_3968;
  undefined8 uStack_3960;
  undefined8 local_3958;
  undefined8 uStack_3950;
  undefined8 local_3948;
  undefined8 uStack_3940;
  undefined8 local_3938;
  undefined8 uStack_3930;
  undefined8 local_3928;
  undefined8 uStack_3920;
  undefined8 local_3918;
  undefined8 uStack_3910;
  float local_3908;
  float fStack_3904;
  float fStack_3900;
  float fStack_38fc;
  undefined8 *local_38f0;
  float local_38e8;
  float fStack_38e4;
  float fStack_38e0;
  float fStack_38dc;
  undefined8 *local_38d0;
  float local_38c8;
  float fStack_38c4;
  float fStack_38c0;
  float fStack_38bc;
  undefined8 *local_38b0;
  float local_38a8;
  float fStack_38a4;
  float fStack_38a0;
  float fStack_389c;
  undefined8 *local_3890;
  undefined4 local_3888;
  undefined4 uStack_3884;
  undefined4 uStack_3880;
  undefined4 uStack_387c;
  undefined4 local_386c;
  undefined4 local_3868;
  undefined4 uStack_3864;
  undefined4 uStack_3860;
  undefined4 uStack_385c;
  undefined4 local_384c;
  undefined4 local_3848;
  undefined4 uStack_3844;
  undefined4 uStack_3840;
  undefined4 uStack_383c;
  undefined4 local_382c;
  undefined4 local_3828;
  undefined4 uStack_3824;
  undefined4 uStack_3820;
  undefined4 uStack_381c;
  undefined4 local_380c;
  float local_3808;
  float fStack_3804;
  float fStack_3800;
  float fStack_37fc;
  float local_37ec;
  float local_37e8;
  float fStack_37e4;
  float fStack_37e0;
  float fStack_37dc;
  float local_37cc;
  float local_37c8;
  float fStack_37c4;
  float fStack_37c0;
  float fStack_37bc;
  float local_37b8;
  undefined8 local_37a8;
  undefined8 uStack_37a0;
  ulong *local_3798;
  ulong *local_3790;
  ulong local_3788;
  ulong uStack_3780;
  ulong *local_3770;
  undefined8 local_3768;
  undefined8 uStack_3760;
  undefined4 local_374c;
  undefined8 local_3748;
  undefined8 uStack_3740;
  undefined4 local_3738;
  undefined4 local_3734;
  undefined4 local_3730;
  undefined4 local_372c;
  undefined8 local_3728;
  undefined8 uStack_3720;
  ulong local_3718;
  ulong uStack_3710;
  undefined8 local_3708;
  undefined8 uStack_3700;
  undefined8 *local_36f0;
  undefined8 *local_36e8;
  undefined8 *local_36e0;
  undefined8 *local_36d8;
  undefined8 *local_36d0;
  undefined8 *local_36c8;
  undefined8 *local_36c0;
  undefined8 local_36b8;
  undefined8 uStack_36b0;
  undefined8 local_36a8;
  undefined8 uStack_36a0;
  float local_3698;
  float fStack_3694;
  float fStack_3690;
  float fStack_368c;
  undefined8 *local_3688;
  undefined8 *local_3680;
  undefined8 *local_3678;
  undefined8 *local_3670;
  float local_3668;
  float fStack_3664;
  float fStack_3660;
  float fStack_365c;
  undefined8 *local_3650;
  undefined8 local_3648;
  undefined8 uStack_3640;
  undefined8 local_3638;
  undefined8 uStack_3630;
  undefined8 local_3628;
  undefined8 uStack_3620;
  undefined8 *local_3610;
  undefined8 *local_3608;
  undefined8 *local_3600;
  undefined8 *local_35f8;
  undefined8 *local_35f0;
  undefined8 *local_35e8;
  undefined8 *local_35e0;
  undefined8 local_35d8;
  undefined8 uStack_35d0;
  undefined8 local_35c8;
  undefined8 uStack_35c0;
  float local_35b8;
  float fStack_35b4;
  float fStack_35b0;
  float fStack_35ac;
  undefined8 *local_35a8;
  undefined8 *local_35a0;
  undefined8 *local_3598;
  undefined8 *local_3590;
  float local_3588;
  float fStack_3584;
  float fStack_3580;
  float fStack_357c;
  undefined8 *local_3570;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined8 local_3558;
  undefined8 uStack_3550;
  undefined8 local_3548;
  undefined8 uStack_3540;
  undefined8 *local_3530;
  undefined8 *local_3528;
  undefined8 *local_3520;
  undefined8 *local_3518;
  undefined8 *local_3510;
  undefined8 *local_3508;
  undefined8 *local_3500;
  undefined8 local_34f8;
  undefined8 uStack_34f0;
  undefined8 local_34e8;
  undefined8 uStack_34e0;
  float local_34d8;
  float fStack_34d4;
  float fStack_34d0;
  float fStack_34cc;
  undefined8 *local_34c8;
  undefined8 *local_34c0;
  undefined8 *local_34b8;
  undefined8 *local_34b0;
  float local_34a8;
  float fStack_34a4;
  float fStack_34a0;
  float fStack_349c;
  undefined8 *local_3490;
  undefined8 local_3488;
  undefined8 uStack_3480;
  undefined8 local_3478;
  undefined8 uStack_3470;
  undefined8 local_3468;
  undefined8 uStack_3460;
  undefined8 local_3458;
  undefined8 uStack_3450;
  undefined8 local_3448;
  undefined8 uStack_3440;
  undefined8 *local_3430;
  ulong *local_3428;
  undefined8 *local_3420;
  undefined8 local_3418;
  undefined8 uStack_3410;
  undefined8 local_3408;
  undefined8 uStack_3400;
  undefined8 local_33f8;
  undefined8 uStack_33f0;
  undefined8 *local_33e0;
  undefined8 *local_33d8;
  undefined8 *local_33d0;
  undefined8 local_33c8;
  undefined8 uStack_33c0;
  undefined8 local_33b8;
  undefined8 uStack_33b0;
  undefined8 local_33a8;
  undefined8 uStack_33a0;
  undefined8 *local_3390;
  undefined8 *local_3388;
  undefined8 *local_3380;
  undefined8 local_3378;
  undefined8 uStack_3370;
  undefined8 local_3368;
  undefined8 uStack_3360;
  undefined8 local_3358;
  undefined8 uStack_3350;
  undefined8 local_3348;
  undefined8 uStack_3340;
  undefined8 local_3338;
  undefined8 uStack_3330;
  undefined8 *local_3320;
  undefined8 *local_3318;
  undefined8 *local_3310;
  float local_3304;
  undefined8 *local_3300;
  float local_32f4;
  undefined8 *local_32f0;
  float local_32e4;
  undefined8 *local_32e0;
  float local_32d8;
  float fStack_32d4;
  float fStack_32d0;
  float fStack_32cc;
  float local_32bc;
  float local_32b8;
  float fStack_32b4;
  float fStack_32b0;
  float fStack_32ac;
  float local_329c;
  float local_3298;
  float fStack_3294;
  float fStack_3290;
  float fStack_328c;
  float local_3284;
  undefined8 *local_3280;
  undefined8 *local_3278;
  undefined8 *local_3270;
  float local_3268;
  float fStack_3264;
  float fStack_3260;
  float fStack_325c;
  undefined8 *local_3250;
  undefined8 local_3248;
  undefined8 uStack_3240;
  undefined8 local_3238;
  undefined8 uStack_3230;
  undefined8 local_3228;
  undefined8 uStack_3220;
  undefined8 *local_3210;
  undefined8 *local_3208;
  undefined8 *local_3200;
  undefined8 *local_31f8;
  undefined8 *local_31f0;
  undefined8 *local_31e8;
  undefined8 *local_31e0;
  undefined8 local_31d8;
  undefined8 uStack_31d0;
  undefined8 local_31c8;
  undefined8 uStack_31c0;
  float local_31b8;
  float fStack_31b4;
  float fStack_31b0;
  float fStack_31ac;
  undefined8 *local_31a8;
  undefined8 *local_31a0;
  undefined8 *local_3198;
  undefined8 *local_3190;
  float local_3188;
  float fStack_3184;
  float fStack_3180;
  float fStack_317c;
  undefined8 *local_3170;
  undefined8 local_3168;
  undefined8 uStack_3160;
  undefined8 local_3158;
  undefined8 uStack_3150;
  undefined8 local_3148;
  undefined8 uStack_3140;
  undefined8 *local_3130;
  undefined8 *local_3128;
  undefined8 *local_3120;
  undefined8 *local_3118;
  undefined8 *local_3110;
  undefined8 *local_3108;
  undefined8 *local_3100;
  undefined8 local_30f8;
  undefined8 uStack_30f0;
  undefined8 local_30e8;
  undefined8 uStack_30e0;
  float local_30d8;
  float fStack_30d4;
  float fStack_30d0;
  float fStack_30cc;
  undefined8 *local_30c8;
  undefined8 *local_30c0;
  undefined8 *local_30b8;
  undefined8 *local_30b0;
  float local_30a8;
  float fStack_30a4;
  float fStack_30a0;
  float fStack_309c;
  undefined8 *local_3090;
  undefined8 local_3088;
  undefined8 uStack_3080;
  undefined8 local_3078;
  undefined8 uStack_3070;
  undefined8 local_3068;
  undefined8 uStack_3060;
  undefined8 local_3058;
  undefined8 uStack_3050;
  undefined8 local_3048;
  undefined8 uStack_3040;
  undefined8 local_3038;
  undefined8 uStack_3030;
  undefined8 local_3028;
  undefined8 uStack_3020;
  undefined8 *local_3010;
  undefined8 *local_3008;
  undefined8 *local_3000;
  float local_2ff4;
  undefined8 *local_2ff0;
  float local_2fe4;
  undefined8 *local_2fe0;
  float local_2fd4;
  undefined8 *local_2fd0;
  float local_2fc8;
  float fStack_2fc4;
  float fStack_2fc0;
  float fStack_2fbc;
  float local_2fac;
  float local_2fa8;
  float fStack_2fa4;
  float fStack_2fa0;
  float fStack_2f9c;
  float local_2f8c;
  float local_2f88;
  float fStack_2f84;
  float fStack_2f80;
  float fStack_2f7c;
  float local_2f74;
  undefined8 *local_2f70;
  undefined8 *local_2f68;
  undefined8 *local_2f60;
  float local_2f58;
  float fStack_2f54;
  float fStack_2f50;
  float fStack_2f4c;
  undefined8 *local_2f40;
  undefined8 local_2f38;
  undefined8 uStack_2f30;
  undefined8 local_2f28;
  undefined8 uStack_2f20;
  undefined8 local_2f18;
  undefined8 uStack_2f10;
  undefined8 *local_2f00;
  undefined8 *local_2ef8;
  undefined8 *local_2ef0;
  undefined8 *local_2ee8;
  undefined8 *local_2ee0;
  undefined8 *local_2ed8;
  undefined8 *local_2ed0;
  undefined8 local_2ec8;
  undefined8 uStack_2ec0;
  undefined8 local_2eb8;
  undefined8 uStack_2eb0;
  float local_2ea8;
  float fStack_2ea4;
  float fStack_2ea0;
  float fStack_2e9c;
  undefined8 *local_2e98;
  undefined8 *local_2e90;
  undefined8 *local_2e88;
  undefined8 *local_2e80;
  float local_2e78;
  float fStack_2e74;
  float fStack_2e70;
  float fStack_2e6c;
  undefined8 *local_2e60;
  undefined8 local_2e58;
  undefined8 uStack_2e50;
  undefined8 local_2e48;
  undefined8 uStack_2e40;
  undefined8 local_2e38;
  undefined8 uStack_2e30;
  undefined8 *local_2e20;
  undefined8 *local_2e18;
  undefined8 *local_2e10;
  undefined8 *local_2e08;
  undefined8 *local_2e00;
  undefined8 *local_2df8;
  undefined8 *local_2df0;
  undefined8 local_2de8;
  undefined8 uStack_2de0;
  undefined8 local_2dd8;
  undefined8 uStack_2dd0;
  float local_2dc8;
  float fStack_2dc4;
  float fStack_2dc0;
  float fStack_2dbc;
  undefined8 *local_2db8;
  undefined8 *local_2db0;
  undefined8 *local_2da8;
  undefined8 *local_2da0;
  float local_2d98;
  float fStack_2d94;
  float fStack_2d90;
  float fStack_2d8c;
  undefined8 *local_2d80;
  undefined8 local_2d78;
  undefined8 uStack_2d70;
  undefined8 local_2d68;
  undefined8 uStack_2d60;
  undefined8 local_2d58;
  undefined8 uStack_2d50;
  undefined8 local_2d48;
  undefined8 uStack_2d40;
  undefined8 local_2d38;
  undefined8 uStack_2d30;
  undefined8 local_2d28;
  undefined8 uStack_2d20;
  undefined8 local_2d18;
  undefined8 uStack_2d10;
  undefined8 *local_2d00;
  undefined8 *local_2cf8;
  undefined8 *local_2cf0;
  undefined4 local_2ce4;
  undefined8 *local_2ce0;
  float local_2cd4;
  undefined8 *local_2cd0;
  float local_2cc4;
  undefined8 *local_2cc0;
  float local_2cb8;
  float fStack_2cb4;
  float fStack_2cb0;
  float fStack_2cac;
  float local_2c9c;
  float local_2c98;
  float fStack_2c94;
  float fStack_2c90;
  float fStack_2c8c;
  float local_2c7c;
  undefined4 local_2c78;
  undefined4 uStack_2c74;
  undefined4 uStack_2c70;
  undefined4 uStack_2c6c;
  undefined4 local_2c64;
  undefined8 *local_2c60;
  undefined8 *local_2c58;
  undefined8 *local_2c50;
  float local_2c48;
  float fStack_2c44;
  float fStack_2c40;
  float fStack_2c3c;
  undefined8 *local_2c30;
  undefined8 local_2c28;
  undefined8 uStack_2c20;
  undefined8 local_2c18;
  undefined8 uStack_2c10;
  undefined8 local_2c08;
  undefined8 uStack_2c00;
  undefined8 *local_2bf0;
  undefined8 *local_2be8;
  undefined8 *local_2be0;
  undefined8 *local_2bd8;
  undefined8 *local_2bd0;
  undefined8 *local_2bc8;
  undefined8 *local_2bc0;
  undefined8 local_2bb8;
  undefined8 uStack_2bb0;
  undefined8 local_2ba8;
  undefined8 uStack_2ba0;
  float local_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  undefined8 *local_2b88;
  undefined8 *local_2b80;
  undefined8 *local_2b78;
  undefined8 *local_2b70;
  float local_2b68;
  float fStack_2b64;
  float fStack_2b60;
  float fStack_2b5c;
  undefined8 *local_2b50;
  undefined8 local_2b48;
  undefined8 uStack_2b40;
  undefined8 local_2b38;
  undefined8 uStack_2b30;
  undefined8 local_2b28;
  undefined8 uStack_2b20;
  undefined8 *local_2b10;
  undefined8 *local_2b08;
  undefined8 *local_2b00;
  undefined8 *local_2af8;
  undefined8 *local_2af0;
  undefined8 *local_2ae8;
  undefined8 *local_2ae0;
  undefined8 local_2ad8;
  undefined8 uStack_2ad0;
  undefined8 local_2ac8;
  undefined8 uStack_2ac0;
  float local_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  undefined8 *local_2aa8;
  undefined8 *local_2aa0;
  undefined8 *local_2a98;
  undefined8 *local_2a90;
  float local_2a88;
  float fStack_2a84;
  float fStack_2a80;
  float fStack_2a7c;
  undefined8 *local_2a70;
  undefined8 local_2a68;
  undefined8 uStack_2a60;
  undefined8 local_2a58;
  undefined8 uStack_2a50;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  undefined8 local_2a38;
  undefined8 uStack_2a30;
  undefined8 local_2a28;
  undefined8 uStack_2a20;
  undefined8 local_2a18;
  undefined8 uStack_2a10;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  undefined8 *local_29f0;
  undefined8 *local_29e8;
  undefined8 *local_29e0;
  float local_29d4;
  undefined8 *local_29d0;
  float local_29c4;
  undefined8 *local_29c0;
  float local_29b4;
  undefined8 *local_29b0;
  float local_29a8;
  float fStack_29a4;
  float fStack_29a0;
  float fStack_299c;
  float local_298c;
  float local_2988;
  float fStack_2984;
  float fStack_2980;
  float fStack_297c;
  float local_296c;
  float local_2968;
  float fStack_2964;
  float fStack_2960;
  float fStack_295c;
  float local_2954;
  undefined8 *local_2950;
  undefined8 *local_2948;
  undefined8 *local_2940;
  float local_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  undefined8 *local_2920;
  undefined8 local_2918;
  undefined8 uStack_2910;
  undefined8 local_2908;
  undefined8 uStack_2900;
  undefined8 local_28f8;
  undefined8 uStack_28f0;
  undefined8 *local_28e0;
  undefined8 *local_28d8;
  undefined8 *local_28d0;
  undefined8 *local_28c8;
  undefined8 *local_28c0;
  undefined8 *local_28b8;
  undefined8 *local_28b0;
  undefined8 local_28a8;
  undefined8 uStack_28a0;
  undefined8 local_2898;
  undefined8 uStack_2890;
  float local_2888;
  float fStack_2884;
  float fStack_2880;
  float fStack_287c;
  undefined8 *local_2878;
  undefined8 *local_2870;
  undefined8 *local_2868;
  undefined8 *local_2860;
  float local_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  undefined8 *local_2840;
  undefined8 local_2838;
  undefined8 uStack_2830;
  undefined8 local_2828;
  undefined8 uStack_2820;
  undefined8 local_2818;
  undefined8 uStack_2810;
  undefined8 *local_2800;
  undefined8 *local_27f8;
  undefined8 *local_27f0;
  undefined8 *local_27e8;
  undefined8 *local_27e0;
  undefined8 *local_27d8;
  undefined8 *local_27d0;
  undefined8 local_27c8;
  undefined8 uStack_27c0;
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  float local_27a8;
  float fStack_27a4;
  float fStack_27a0;
  float fStack_279c;
  undefined8 *local_2798;
  undefined8 *local_2790;
  undefined8 *local_2788;
  undefined8 *local_2780;
  float local_2778;
  float fStack_2774;
  float fStack_2770;
  float fStack_276c;
  undefined8 *local_2760;
  undefined8 local_2758;
  undefined8 uStack_2750;
  undefined8 local_2748;
  undefined8 uStack_2740;
  undefined8 local_2738;
  undefined8 uStack_2730;
  undefined8 local_2728;
  undefined8 uStack_2720;
  undefined8 local_2718;
  undefined8 uStack_2710;
  undefined8 local_2708;
  undefined8 uStack_2700;
  undefined8 local_26f8;
  undefined8 uStack_26f0;
  undefined8 *local_26e0;
  undefined8 *local_26d8;
  undefined8 *local_26d0;
  float local_26c4;
  undefined8 *local_26c0;
  float local_26b4;
  undefined8 *local_26b0;
  float local_26a4;
  undefined8 *local_26a0;
  float local_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float local_267c;
  float local_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float local_265c;
  float local_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float local_2644;
  undefined8 *local_2640;
  undefined8 *local_2638;
  undefined8 *local_2630;
  float local_2628;
  float fStack_2624;
  float fStack_2620;
  float fStack_261c;
  undefined8 *local_2610;
  undefined8 local_2608;
  undefined8 uStack_2600;
  undefined8 local_25f8;
  undefined8 uStack_25f0;
  undefined8 local_25e8;
  undefined8 uStack_25e0;
  undefined8 *local_25d0;
  undefined8 *local_25c8;
  undefined8 *local_25c0;
  undefined8 *local_25b8;
  undefined8 *local_25b0;
  undefined8 *local_25a8;
  undefined8 *local_25a0;
  undefined8 local_2598;
  undefined8 uStack_2590;
  undefined8 local_2588;
  undefined8 uStack_2580;
  float local_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  undefined8 *local_2568;
  undefined8 *local_2560;
  undefined8 *local_2558;
  undefined8 *local_2550;
  float local_2548;
  float fStack_2544;
  float fStack_2540;
  float fStack_253c;
  undefined8 *local_2530;
  undefined8 local_2528;
  undefined8 uStack_2520;
  undefined8 local_2518;
  undefined8 uStack_2510;
  undefined8 local_2508;
  undefined8 uStack_2500;
  undefined8 *local_24f0;
  undefined8 *local_24e8;
  undefined8 *local_24e0;
  undefined8 *local_24d8;
  undefined8 *local_24d0;
  undefined8 *local_24c8;
  undefined8 *local_24c0;
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  undefined8 local_24a8;
  undefined8 uStack_24a0;
  float local_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  undefined8 *local_2488;
  undefined8 *local_2480;
  undefined8 *local_2478;
  undefined8 *local_2470;
  float local_2468;
  float fStack_2464;
  float fStack_2460;
  float fStack_245c;
  undefined8 *local_2450;
  undefined8 local_2448;
  undefined8 uStack_2440;
  undefined8 local_2438;
  undefined8 uStack_2430;
  undefined8 local_2428;
  undefined8 uStack_2420;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 local_2408;
  undefined8 uStack_2400;
  undefined8 local_23f8;
  undefined8 uStack_23f0;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  undefined8 *local_23d0;
  undefined8 *local_23c8;
  undefined8 *local_23c0;
  float local_23b4;
  undefined8 *local_23b0;
  float local_23a4;
  undefined8 *local_23a0;
  float local_2394;
  undefined8 *local_2390;
  float local_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  float local_236c;
  float local_2368;
  float fStack_2364;
  float fStack_2360;
  float fStack_235c;
  float local_234c;
  float local_2348;
  float fStack_2344;
  float fStack_2340;
  float fStack_233c;
  float local_2334;
  undefined8 *local_2330;
  undefined8 *local_2328;
  undefined8 *local_2320;
  float local_2318;
  float fStack_2314;
  float fStack_2310;
  float fStack_230c;
  undefined8 *local_2300;
  undefined8 local_22f8;
  undefined8 uStack_22f0;
  undefined8 local_22e8;
  undefined8 uStack_22e0;
  undefined8 local_22d8;
  undefined8 uStack_22d0;
  undefined8 *local_22c0;
  undefined8 *local_22b8;
  undefined8 *local_22b0;
  undefined8 *local_22a8;
  undefined8 *local_22a0;
  undefined8 *local_2298;
  undefined8 *local_2290;
  undefined8 local_2288;
  undefined8 uStack_2280;
  undefined8 local_2278;
  undefined8 uStack_2270;
  float local_2268;
  float fStack_2264;
  float fStack_2260;
  float fStack_225c;
  undefined8 *local_2258;
  undefined8 *local_2250;
  undefined8 *local_2248;
  undefined8 *local_2240;
  float local_2238;
  float fStack_2234;
  float fStack_2230;
  float fStack_222c;
  undefined8 *local_2220;
  undefined8 local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  undefined8 *local_21e0;
  undefined8 *local_21d8;
  undefined8 *local_21d0;
  undefined8 *local_21c8;
  undefined8 *local_21c0;
  undefined8 *local_21b8;
  undefined8 *local_21b0;
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  float local_2188;
  float fStack_2184;
  float fStack_2180;
  float fStack_217c;
  undefined8 *local_2178;
  undefined8 *local_2170;
  undefined8 *local_2168;
  undefined8 *local_2160;
  float local_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  undefined8 *local_2140;
  undefined8 local_2138;
  undefined8 uStack_2130;
  undefined8 local_2128;
  undefined8 uStack_2120;
  undefined8 local_2118;
  undefined8 uStack_2110;
  undefined8 local_2108;
  undefined8 uStack_2100;
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined8 *local_20c0;
  ulong *local_20b8;
  undefined8 *local_20b0;
  float local_20a4;
  undefined8 *local_20a0;
  float local_2094;
  undefined8 *local_2090;
  float local_2084;
  undefined8 *local_2080;
  float local_2078;
  float fStack_2074;
  float fStack_2070;
  float fStack_206c;
  float local_205c;
  float local_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  float local_203c;
  float local_2038;
  float fStack_2034;
  float fStack_2030;
  float fStack_202c;
  float local_2024;
  undefined8 *local_2020;
  undefined8 *local_2018;
  undefined8 *local_2010;
  float local_2008;
  float fStack_2004;
  float fStack_2000;
  float fStack_1ffc;
  undefined8 *local_1ff0;
  undefined8 local_1fe8;
  undefined8 uStack_1fe0;
  undefined8 local_1fd8;
  undefined8 uStack_1fd0;
  undefined8 local_1fc8;
  undefined8 uStack_1fc0;
  undefined8 *local_1fb0;
  ulong *local_1fa8;
  undefined8 *local_1fa0;
  undefined8 *local_1f98;
  undefined8 *local_1f90;
  undefined8 *local_1f88;
  undefined8 *local_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  float local_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  undefined8 *local_1f48;
  ulong *local_1f40;
  undefined8 *local_1f38;
  undefined8 *local_1f30;
  float local_1f28;
  float fStack_1f24;
  float fStack_1f20;
  float fStack_1f1c;
  undefined8 *local_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined8 *local_1ed0;
  undefined8 *local_1ec8;
  undefined8 *local_1ec0;
  undefined8 *local_1eb8;
  undefined8 *local_1eb0;
  undefined8 *local_1ea8;
  undefined8 *local_1ea0;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  float local_1e78;
  float fStack_1e74;
  float fStack_1e70;
  float fStack_1e6c;
  undefined8 *local_1e68;
  undefined8 *local_1e60;
  undefined8 *local_1e58;
  undefined8 *local_1e50;
  float local_1e48;
  float fStack_1e44;
  float fStack_1e40;
  float fStack_1e3c;
  undefined8 *local_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 *local_1db0;
  ulong *local_1da8;
  undefined8 *local_1da0;
  float local_1d94;
  undefined8 *local_1d90;
  float local_1d84;
  undefined8 *local_1d80;
  float local_1d74;
  undefined8 *local_1d70;
  float local_1d68;
  float fStack_1d64;
  float fStack_1d60;
  float fStack_1d5c;
  float local_1d4c;
  float local_1d48;
  float fStack_1d44;
  float fStack_1d40;
  float fStack_1d3c;
  float local_1d2c;
  float local_1d28;
  float fStack_1d24;
  float fStack_1d20;
  float fStack_1d1c;
  float local_1d14;
  undefined8 *local_1d10;
  undefined8 *local_1d08;
  undefined8 *local_1d00;
  float local_1cf8;
  float fStack_1cf4;
  float fStack_1cf0;
  float fStack_1cec;
  undefined8 *local_1ce0;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 *local_1ca0;
  ulong *local_1c98;
  undefined8 *local_1c90;
  undefined8 *local_1c88;
  undefined8 *local_1c80;
  undefined8 *local_1c78;
  undefined8 *local_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  float local_1c48;
  float fStack_1c44;
  float fStack_1c40;
  float fStack_1c3c;
  undefined8 *local_1c38;
  ulong *local_1c30;
  undefined8 *local_1c28;
  undefined8 *local_1c20;
  float local_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  undefined8 *local_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 *local_1bc0;
  undefined8 *local_1bb8;
  undefined8 *local_1bb0;
  undefined8 *local_1ba8;
  undefined8 *local_1ba0;
  undefined8 *local_1b98;
  undefined8 *local_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  float local_1b68;
  float fStack_1b64;
  float fStack_1b60;
  float fStack_1b5c;
  undefined8 *local_1b58;
  undefined8 *local_1b50;
  undefined8 *local_1b48;
  undefined8 *local_1b40;
  float local_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  undefined8 *local_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 *local_1aa0;
  ulong *local_1a98;
  undefined8 *local_1a90;
  undefined4 local_1a84;
  undefined8 *local_1a80;
  float local_1a74;
  undefined8 *local_1a70;
  float local_1a64;
  undefined8 *local_1a60;
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float local_1a3c;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float local_1a1c;
  undefined4 local_1a18;
  undefined4 uStack_1a14;
  undefined4 uStack_1a10;
  undefined4 uStack_1a0c;
  undefined4 local_1a04;
  undefined8 *local_1a00;
  undefined8 *local_19f8;
  undefined8 *local_19f0;
  float local_19e8;
  float fStack_19e4;
  float fStack_19e0;
  float fStack_19dc;
  undefined8 *local_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 *local_1990;
  ulong *local_1988;
  undefined8 *local_1980;
  undefined8 *local_1978;
  undefined8 *local_1970;
  undefined8 *local_1968;
  undefined8 *local_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  float local_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  undefined8 *local_1928;
  ulong *local_1920;
  undefined8 *local_1918;
  undefined8 *local_1910;
  float local_1908;
  float fStack_1904;
  float fStack_1900;
  float fStack_18fc;
  undefined8 *local_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 *local_18b0;
  undefined8 *local_18a8;
  undefined8 *local_18a0;
  undefined8 *local_1898;
  undefined8 *local_1890;
  undefined8 *local_1888;
  undefined8 *local_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  float local_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  undefined8 *local_1848;
  undefined8 *local_1840;
  undefined8 *local_1838;
  undefined8 *local_1830;
  float local_1828;
  float fStack_1824;
  float fStack_1820;
  float fStack_181c;
  undefined8 *local_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 *local_1790;
  ulong *local_1788;
  undefined8 *local_1780;
  float local_1774;
  undefined8 *local_1770;
  float local_1764;
  undefined8 *local_1760;
  float local_1754;
  undefined8 *local_1750;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f4;
  undefined8 *local_16f0;
  undefined8 *local_16e8;
  undefined8 *local_16e0;
  float local_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  undefined8 *local_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 *local_1680;
  ulong *local_1678;
  undefined8 *local_1670;
  undefined8 *local_1668;
  undefined8 *local_1660;
  undefined8 *local_1658;
  undefined8 *local_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  float local_1628;
  float fStack_1624;
  float fStack_1620;
  float fStack_161c;
  undefined8 *local_1618;
  ulong *local_1610;
  undefined8 *local_1608;
  undefined8 *local_1600;
  float local_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  undefined8 *local_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 *local_15a0;
  undefined8 *local_1598;
  undefined8 *local_1590;
  undefined8 *local_1588;
  undefined8 *local_1580;
  undefined8 *local_1578;
  undefined8 *local_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  float local_1548;
  float fStack_1544;
  float fStack_1540;
  float fStack_153c;
  undefined8 *local_1538;
  undefined8 *local_1530;
  undefined8 *local_1528;
  undefined8 *local_1520;
  float local_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  undefined8 *local_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 *local_1480;
  undefined8 *local_1478;
  undefined8 *local_1470;
  float local_1464;
  undefined8 *local_1460;
  float local_1454;
  undefined8 *local_1450;
  float local_1444;
  undefined8 *local_1440;
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float local_141c;
  float local_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float local_13fc;
  float local_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float local_13e4;
  undefined8 *local_13e0;
  undefined8 *local_13d8;
  undefined8 *local_13d0;
  float local_13c8;
  float fStack_13c4;
  float fStack_13c0;
  float fStack_13bc;
  undefined8 *local_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 *local_1370;
  undefined8 *local_1368;
  undefined8 *local_1360;
  undefined8 *local_1358;
  undefined8 *local_1350;
  undefined8 *local_1348;
  undefined8 *local_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  undefined8 *local_1308;
  undefined8 *local_1300;
  undefined8 *local_12f8;
  undefined8 *local_12f0;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  undefined8 *local_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 *local_1290;
  undefined8 *local_1288;
  undefined8 *local_1280;
  undefined8 *local_1278;
  undefined8 *local_1270;
  undefined8 *local_1268;
  undefined8 *local_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  undefined8 *local_1228;
  undefined8 *local_1220;
  undefined8 *local_1218;
  undefined8 *local_1210;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined8 *local_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 *local_1170;
  undefined8 *local_1168;
  undefined8 *local_1160;
  float local_1154;
  undefined8 *local_1150;
  float local_1144;
  undefined8 *local_1140;
  float local_1134;
  undefined8 *local_1130;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d4;
  undefined8 *local_10d0;
  undefined8 *local_10c8;
  undefined8 *local_10c0;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined8 *local_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 *local_1060;
  undefined8 *local_1058;
  undefined8 *local_1050;
  undefined8 *local_1048;
  undefined8 *local_1040;
  undefined8 *local_1038;
  undefined8 *local_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined8 *local_ff8;
  undefined8 *local_ff0;
  undefined8 *local_fe8;
  undefined8 *local_fe0;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined8 *local_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 *local_f80;
  undefined8 *local_f78;
  undefined8 *local_f70;
  undefined8 *local_f68;
  undefined8 *local_f60;
  undefined8 *local_f58;
  undefined8 *local_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  float local_f28;
  float fStack_f24;
  float fStack_f20;
  float fStack_f1c;
  undefined8 *local_f18;
  undefined8 *local_f10;
  undefined8 *local_f08;
  undefined8 *local_f00;
  float local_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  undefined8 *local_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 *local_eb8;
  undefined8 *local_eb0;
  undefined8 *local_ea8;
  ulong *local_ea0;
  undefined8 *local_e98;
  undefined8 *local_e90;
  undefined8 *local_e88;
  undefined8 *local_e80;
  undefined8 *local_e78;
  undefined8 *local_e70;
  undefined8 *local_e68;
  undefined8 *local_e60;
  undefined8 *local_e58;
  undefined8 *local_e50;
  ulong *local_e48;
  undefined8 *local_e40;
  undefined8 *local_e38;
  undefined8 *local_e30;
  undefined8 *local_e28;
  undefined8 *local_e20;
  undefined8 *local_e18;
  undefined8 *local_e10;
  undefined8 *local_e08;
  undefined8 *local_e00;
  undefined8 *local_df8;
  undefined8 *local_df0;
  undefined8 *local_de8;
  undefined8 *local_de0;
  undefined8 *local_dd8;
  undefined8 *local_dd0;
  undefined8 *local_dc8;
  undefined8 *local_dc0;
  undefined8 *local_db8;
  undefined8 *local_db0;
  undefined8 *local_da8;
  undefined8 *local_da0;
  undefined8 *local_d98;
  undefined8 *local_d90;
  undefined8 *local_d88;
  undefined8 *local_d80;
  undefined8 *local_d78;
  undefined8 *local_d70;
  undefined8 *local_d68;
  undefined8 *local_d60;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  undefined8 *local_d38;
  undefined8 *local_d30;
  undefined8 *local_d28;
  ulong *local_d20;
  undefined8 *local_d18;
  undefined8 *local_d10;
  undefined8 *local_d08;
  undefined8 *local_d00;
  ulong *local_cf8;
  undefined8 *local_cf0;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  undefined8 *local_cd8;
  undefined8 *local_cd0;
  ulong *local_cc8;
  ulong *local_cc0;
  undefined8 *local_cb8;
  undefined8 *local_cb0;
  undefined8 *local_ca8;
  undefined8 *local_ca0;
  undefined8 *local_c98;
  undefined8 *local_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  undefined8 *local_c78;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 *local_c58;
  undefined8 *local_c50;
  undefined8 *local_c48;
  undefined8 *local_c40;
  undefined8 *local_c38;
  undefined8 *local_c30;
  undefined8 *local_c28;
  undefined8 *local_c20;
  undefined8 *local_c18;
  undefined8 *local_c10;
  undefined8 *local_c08;
  undefined8 *local_c00;
  undefined8 *local_bf8;
  undefined8 *local_bf0;
  undefined8 *local_be8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined8 *local_bc8;
  undefined8 *local_bc0;
  undefined8 *local_bb8;
  undefined8 *local_bb0;
  undefined8 *local_ba8;
  undefined8 *local_ba0;
  undefined8 *local_b98;
  undefined8 *local_b90;
  undefined8 *local_b88;
  undefined8 *local_b80;
  undefined8 *local_b78;
  undefined8 *local_b70;
  undefined8 *local_b68;
  undefined8 *local_b60;
  undefined8 *local_b58;
  undefined8 *local_b50;
  ulong *local_b48;
  undefined8 *local_b40;
  ulong *local_b38;
  undefined8 *local_b30;
  undefined8 local_b28;
  ulong uStack_b20;
  undefined8 local_b18;
  ulong uStack_b10;
  undefined8 local_b08;
  ulong uStack_b00;
  float *local_af0;
  undefined8 *local_ae8;
  undefined8 *local_ae0;
  float local_ad4;
  float local_ad0;
  float local_acc;
  float local_ac8;
  float local_ac4;
  float local_ac0;
  float local_abc;
  float local_ab8;
  float local_ab4;
  float local_ab0;
  float local_aac;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float *local_a98;
  undefined8 *local_a90;
  undefined8 *local_a88;
  undefined8 *local_a80;
  float *local_a78;
  float local_a70;
  float local_a6c;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 *local_a58;
  undefined8 *local_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  float local_a2c;
  undefined8 *local_a28;
  float *local_a20;
  float local_a14;
  undefined8 *local_a10;
  ulong local_a08;
  undefined8 uStack_a00;
  undefined1 local_9f8 [16];
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined4 local_9cc;
  undefined1 local_9c8 [16];
  undefined4 local_9ac;
  undefined1 local_9a8 [16];
  undefined4 local_98c;
  undefined1 local_988 [16];
  undefined4 local_96c;
  undefined8 local_968;
  undefined8 uStack_960;
  ulong local_958;
  undefined8 uStack_950;
  ulong local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  ulong local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  ulong local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  ulong local_8a8;
  undefined8 uStack_8a0;
  ulong local_898;
  undefined8 uStack_890;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_874;
  undefined8 *local_870;
  undefined8 *local_868;
  float *local_860;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float *local_848;
  undefined8 *local_840;
  undefined8 *local_838;
  undefined8 *local_830;
  undefined4 local_828;
  undefined4 uStack_824;
  undefined4 uStack_820;
  undefined4 uStack_81c;
  undefined8 *local_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 *local_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 *local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined4 local_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined4 local_678;
  undefined4 uStack_674;
  undefined4 uStack_670;
  undefined4 uStack_66c;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 *local_648;
  undefined8 *local_640;
  undefined4 local_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined4 uStack_5e0;
  undefined4 uStack_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 *local_558;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  undefined8 *local_538;
  float *local_530;
  float *local_528;
  float *local_520;
  float *local_518;
  float *local_510;
  float *local_508;
  float *local_500;
  float *local_4f8;
  float *local_4f0;
  undefined8 *local_4e8;
  float local_4dc;
  float local_4d8;
  float local_4d4;
  undefined8 *local_4d0;
  float local_4c4;
  float local_4c0;
  float local_4bc;
  undefined8 *local_4b8;
  float local_4ac;
  float local_4a8;
  float local_4a4;
  undefined8 *local_4a0;
  undefined8 local_498;
  ulong uStack_490;
  float local_488;
  float local_484;
  float local_480;
  undefined4 local_47c;
  undefined8 local_478;
  ulong uStack_470;
  float local_468;
  float local_464;
  float local_460;
  undefined4 local_45c;
  undefined8 local_458;
  ulong uStack_450;
  float local_448;
  float local_444;
  float local_440;
  undefined4 local_43c;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined4 local_348;
  undefined4 local_344;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 local_334;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined4 *local_318;
  undefined4 *local_310;
  undefined4 *local_308;
  long local_300;
  undefined4 *local_2f8;
  undefined4 *local_2f0;
  undefined4 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined8 *local_2c0;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined8 *local_2a8;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 local_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 local_22c;
  undefined8 *local_228;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined8 *local_210;
  undefined4 local_204;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined8 *local_1f8;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined8 *local_178;
  undefined4 local_16c;
  undefined4 local_168;
  undefined4 local_164;
  undefined8 *local_160;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  undefined8 *local_148;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  local_418c = in_EDX;
  local_4188 = in_RSI;
  local_4180 = in_RDI;
  local_4198 = rtcNewGeometry(g_device,0);
  rtcSetGeometryTimeStepCount(local_4198,local_418c);
  rtcSetSharedGeometryBuffer(local_4198,0,0,0x5003,DAT_00642688,0,0xc,0xc);
  for (local_419c = 0; puVar4 = _DAT_00642618, local_419c < local_418c; local_419c = local_419c + 1)
  {
    local_41a0 = 1;
    local_41a8 = rtcSetNewGeometryBuffer(local_4198,1,local_419c,0x9003,0x10,8);
    __x = local_420c;
    local_4040 = local_41f8;
    local_4024 = 0;
    local_4028 = 0;
    local_402c = 0;
    local_398c = 0;
    local_3990 = 0;
    local_3994 = 0;
    local_3998 = 0;
    local_39a8 = 0;
    uStack_39a0 = 0;
    local_41f8[0] = 0;
    local_41f8[1] = 0;
    local_4048 = &local_4208;
    local_400c = 0;
    local_4010 = 0x3f800000;
    local_4014 = 0;
    local_39ac = 0;
    local_39b0 = 0;
    local_39b4 = 0x3f800000;
    local_39b8 = 0;
    local_39c8 = 0x3f80000000000000;
    uStack_39c0 = 0;
    local_4208 = 0x3f80000000000000;
    uStack_4200 = 0;
    puVar1 = local_41f8 + 2;
    local_4050 = &local_420c;
    local_3b18 = &local_40e8;
    local_40e8 = 0;
    uStack_40e0 = 0;
    local_eb0 = &local_3b48;
    local_98 = &one;
    local_38 = &zero;
    local_40 = &zero;
    local_214 = 0x3f800000;
    local_218 = 0;
    local_21c = 0;
    local_17c = 0;
    local_180 = 0;
    local_184 = 0;
    local_188 = 0x3f800000;
    local_198 = 0x3f800000;
    uStack_190 = 0;
    local_3b48 = 0x3f800000;
    uStack_3b40 = 0;
    local_1f8 = &local_3b38;
    local_48 = &zero;
    local_a0 = &one;
    local_50 = &zero;
    local_1fc = 0;
    local_200 = 0x3f800000;
    local_204 = 0;
    local_19c = 0;
    local_1a0 = 0;
    local_1a4 = 0x3f800000;
    local_1a8 = 0;
    local_1b8 = 0x3f80000000000000;
    uStack_1b0 = 0;
    local_3b38 = 0x3f80000000000000;
    uStack_3b30 = 0;
    local_1e0 = &local_3b28;
    local_58 = &zero;
    local_60 = &zero;
    local_a8 = &one;
    local_1e4 = 0;
    local_1e8 = 0;
    local_1ec = 0x3f800000;
    local_1bc = 0;
    local_1c0 = 0x3f800000;
    local_1c4 = 0;
    local_1c8 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0x3f800000;
    local_3b28 = 0;
    uStack_3b20 = 0x3f800000;
    local_b78 = &local_40c8;
    local_b88 = &local_40b8;
    local_40d8 = 0x3f800000;
    uStack_40d0 = 0;
    local_b80 = &local_3b38;
    local_40c8 = 0x3f80000000000000;
    uStack_40c0 = 0;
    local_b90 = &local_3b28;
    local_40b8 = 0;
    uStack_40b0 = 0x3f800000;
    local_d08 = &local_40a8;
    local_40a8 = 0;
    uStack_40a0 = 0;
    local_a78 = &local_aa8;
    local_830 = &local_a68;
    local_7f8 = 0x3f80000000000000;
    uStack_7f0 = 0;
    local_808 = 0x3f80000000000000;
    uStack_800 = 0;
    local_828 = 0;
    uStack_824 = 0x3f800000;
    uStack_820 = 0;
    uStack_81c = 0;
    local_758 = 0x3f80000000000000;
    uStack_750 = 0;
    local_740 = &local_788;
    local_728 = &local_798;
    local_698 = 0x3f8000003f800000;
    uStack_690 = 0x3f8000003f800000;
    local_718 = &local_7a8;
    local_6f8 = 0;
    uStack_6f0 = 0;
    local_708 = &local_7c8;
    local_678 = 0x3f800000;
    uStack_674 = 0x40000000;
    uStack_670 = 0x3f800000;
    uStack_66c = 0x3f800000;
    local_6e8 = 0x400000003f800000;
    uStack_6e0 = 0x3f8000003f800000;
    local_738 = &local_7b8;
    local_9cc = 0x3f800000;
    uStack_6d4 = 0x40000000;
    uStack_6d0 = 0x3f800000;
    uStack_6cc = 0x3f800000;
    local_768 = 0x400000003f800000;
    uStack_760 = 0x3f8000003f800000;
    local_988 = ZEXT416(0x3f800000);
    local_9e8 = 0x3f800000;
    uStack_9e0 = 0;
    uStack_960 = 0;
    local_9f8 = rsqrtss(ZEXT816(0x3f800000),ZEXT816(0x3f800000));
    local_98c = 0x3fc00000;
    local_9a8 = ZEXT416(0x3fc00000);
    local_8b8 = local_9f8._0_8_;
    uVar2 = local_8b8;
    uStack_8b0 = local_9f8._8_8_;
    local_8b8._0_4_ = local_9f8._0_4_;
    local_8a8 = (ulong)(uint)((float)local_8b8 * 1.5);
    uStack_8a0 = 0;
    local_9ac = 0xbf000000;
    local_9c8 = ZEXT416(0xbf000000);
    local_8d8 = local_9c8._0_8_;
    uStack_8d0 = 0;
    local_8c8 = 0xbf000000;
    uStack_8c0 = 0;
    local_8f8 = local_9f8._0_8_;
    uStack_8f0 = local_9f8._8_8_;
    local_8e8 = (ulong)(uint)((float)local_8b8 * -0.5);
    uStack_8e0 = 0;
    local_918 = local_9f8._0_8_;
    uStack_910 = local_9f8._8_8_;
    local_908 = CONCAT44(local_9f8._4_4_,(float)local_8b8 * (float)local_8b8);
    uStack_900 = local_9f8._8_8_;
    local_938 = local_908;
    uStack_930 = local_9f8._8_8_;
    local_a2c = (float)local_8b8 * -0.5 * (float)local_8b8 * (float)local_8b8;
    local_928 = (ulong)(uint)local_a2c;
    uStack_920 = 0;
    local_958 = local_928;
    uStack_950 = 0;
    local_a2c = (float)local_8b8 * 1.5 + local_a2c;
    local_948 = (ulong)(uint)local_a2c;
    uStack_940 = 0;
    local_a08 = local_948;
    uStack_a00 = 0;
    local_898 = local_948;
    uStack_890 = 0;
    local_a10 = &local_a48;
    local_7e8 = CONCAT44(local_a2c,local_a2c);
    uStack_7e0 = CONCAT44(local_a2c,local_a2c);
    local_7d8 = 0x3f80000000000000;
    uStack_7d0 = 0;
    local_aa8 = local_a2c * 0.0;
    fStack_aa4 = local_a2c * 1.0;
    fStack_aa0 = local_a2c * 0.0;
    fStack_84c = local_a2c * 0.0;
    local_a70 = local_420c;
    local_420c = ((float)local_419c * 6.2831855) / (float)(local_418c - 1);
    local_4038 = puVar1;
    local_4020 = local_4040;
    local_4008 = local_4048;
    local_3b10 = &local_40d8;
    local_eb8 = local_3b18;
    local_ea8 = &local_40d8;
    local_d10 = local_3b18;
    local_ba0 = local_eb0;
    local_b98 = &local_40d8;
    local_b70 = local_eb0;
    local_b68 = &local_40d8;
    local_b60 = &local_40d8;
    local_b58 = local_b78;
    local_b50 = local_b88;
    local_b48 = local_4040;
    local_b40 = local_3b18;
    local_b38 = local_4040;
    local_b30 = local_3b18;
    local_af0 = local_4050;
    local_ae8 = local_4048;
    local_ae0 = &local_4128;
    local_a98 = local_4050;
    local_a90 = local_4048;
    local_a88 = &local_b28;
    local_a80 = local_4048;
    local_a58 = local_4048;
    local_a50 = local_4048;
    local_a28 = local_4048;
    local_a20 = local_a78;
    local_a14 = local_a2c;
    local_96c = local_9cc;
    local_968 = local_9e8;
    local_8b8 = uVar2;
    local_888 = local_a2c;
    fStack_884 = local_a2c;
    fStack_880 = local_a2c;
    fStack_87c = local_a2c;
    local_874 = local_a2c;
    local_870 = local_a10;
    local_868 = local_4048;
    local_860 = local_a78;
    local_858 = local_aa8;
    fStack_854 = fStack_aa4;
    fStack_850 = fStack_aa0;
    local_848 = local_a78;
    local_840 = local_4048;
    local_838 = local_4048;
    local_810 = local_830;
    local_770 = local_830;
    local_730 = local_740;
    local_720 = local_740;
    local_710 = local_718;
    local_700 = local_738;
    local_6d8 = local_9cc;
    local_6c8 = local_738;
    local_6c0 = local_718;
    local_6b8 = local_708;
    local_6b0 = local_728;
    local_6a8 = local_740;
    local_6a0 = local_708;
    local_688 = local_758;
    uStack_680 = uStack_750;
    local_660 = local_708;
    local_658 = local_728;
    local_650 = local_740;
    local_648 = local_740;
    local_640 = local_728;
    local_638 = uStack_824;
    uStack_634 = uStack_824;
    uStack_630 = uStack_824;
    uStack_62c = uStack_824;
    local_628 = local_698;
    uStack_620 = uStack_690;
    local_618 = local_728;
    local_610 = local_740;
    local_608 = local_758;
    uStack_600 = uStack_750;
    local_5f8 = local_740;
    local_5f0 = local_718;
    local_5e8 = uStack_820;
    uStack_5e4 = uStack_820;
    uStack_5e0 = uStack_820;
    uStack_5dc = uStack_820;
    local_5d8 = local_6f8;
    uStack_5d0 = uStack_6f0;
    local_5c8 = local_718;
    local_5c0 = local_740;
    local_5b8 = local_758;
    uStack_5b0 = uStack_750;
    local_228 = local_eb0;
    local_210 = local_eb0;
    local_a68 = local_758;
    uStack_a60 = uStack_750;
    local_a48 = local_7e8;
    uStack_a40 = uStack_7e0;
    local_7c8 = local_6e8;
    uStack_7c0 = uStack_6e0;
    local_7b8 = local_768;
    uStack_7b0 = uStack_760;
    local_7a8 = local_6f8;
    uStack_7a0 = uStack_6f0;
    local_798 = local_698;
    uStack_790 = uStack_690;
    local_788 = local_758;
    uStack_780 = uStack_750;
    local_aac = sinf(__x);
    local_a6c = *local_a98;
    local_ab0 = cosf(local_a6c);
    local_23b4 = local_aa8 * local_aa8 + (1.0 - local_aa8 * local_aa8) * local_ab0;
    local_ac0 = local_aa8 * fStack_aa4 * (1.0 - local_ab0) + fStack_aa0 * local_aac;
    local_acc = local_aa8 * fStack_aa0 * (1.0 - local_ab0) - fStack_aa4 * local_aac;
    local_4f0 = &local_ab4;
    local_4f8 = &local_ab8;
    local_500 = &local_abc;
    local_508 = &local_ac0;
    local_510 = &local_ac4;
    local_518 = &local_ac8;
    local_520 = &local_acc;
    local_528 = &local_ad0;
    local_530 = &local_ad4;
    local_43c = 0;
    local_458 = CONCAT44(local_ac0,local_23b4);
    uStack_450 = (ulong)(uint)local_acc;
    local_4b8 = &local_b18;
    local_4bc = local_ab8;
    local_4c0 = local_ac4;
    local_4c4 = local_ad0;
    local_45c = 0;
    local_478 = CONCAT44(local_ac4,local_ab8);
    uStack_470 = (ulong)(uint)local_ad0;
    local_4a0 = &local_b08;
    local_4a4 = local_abc;
    local_4a8 = local_ac8;
    local_4ac = local_ad4;
    local_47c = 0;
    local_498 = CONCAT44(local_ac8,local_abc);
    uStack_490 = (ulong)(uint)local_ad4;
    local_408 = &local_4118;
    local_400 = &local_4108;
    local_578 = &local_40f8;
    local_398 = &local_b18;
    local_390 = &local_4118;
    local_3a8 = &local_b08;
    local_3a0 = &local_4108;
    local_580 = &local_5a8;
    local_368 = 0;
    uStack_360 = 0;
    local_5a8 = 0;
    uStack_5a0 = 0;
    local_3d20 = &local_4098;
    local_33d0 = &local_3cd8;
    local_23c0 = &local_33f8;
    local_23b0 = &local_23e8;
    local_2208 = CONCAT44(local_23b4,local_23b4);
    uStack_2200 = CONCAT44(local_23b4,local_23b4);
    local_23a4 = local_4128._4_4_;
    local_23a0 = &local_2408;
    local_2128 = CONCAT44(local_4128._4_4_,local_4128._4_4_);
    uStack_2120 = CONCAT44(local_4128._4_4_,local_4128._4_4_);
    local_21d8 = &local_40c8;
    local_2394 = (float)uStack_4120;
    local_2390 = &local_2428;
    local_22e8 = CONCAT44((float)uStack_4120,(float)uStack_4120);
    uStack_22e0 = CONCAT44((float)uStack_4120,(float)uStack_4120);
    local_2330 = &local_40b8;
    local_2320 = &local_2418;
    local_22f8._0_4_ = (float)local_40b8;
    local_22f8._4_4_ = (float)((ulong)local_40b8 >> 0x20);
    uStack_22f0._0_4_ = (float)uStack_40b0;
    uStack_22f0._4_4_ = (float)((ulong)uStack_40b0 >> 0x20);
    local_2318 = (float)uStack_4120 * (float)local_22f8;
    fStack_2314 = (float)uStack_4120 * local_22f8._4_4_;
    fStack_2310 = (float)uStack_4120 * (float)uStack_22f0;
    fStack_230c = (float)uStack_4120 * uStack_22f0._4_4_;
    local_22c0 = &local_23f8;
    local_21b8 = &local_21f8;
    local_2138._0_4_ = (float)local_40c8;
    local_2138._4_4_ = (float)((ulong)local_40c8 >> 0x20);
    uStack_2130._0_4_ = (float)uStack_40c0;
    uStack_2130._4_4_ = (float)((ulong)uStack_40c0 >> 0x20);
    local_2158 = local_4128._4_4_ * (float)local_2138;
    fStack_2154 = local_4128._4_4_ * local_2138._4_4_;
    fStack_2150 = local_4128._4_4_ * (float)uStack_2130;
    fStack_214c = local_4128._4_4_ * uStack_2130._4_4_;
    local_2198 = CONCAT44(fStack_2154,local_2158);
    uStack_2190 = CONCAT44(fStack_214c,fStack_2150);
    local_21a8._0_4_ = (float)local_2418;
    local_21a8._4_4_ = (float)((ulong)local_2418 >> 0x20);
    uStack_21a0._0_4_ = (float)uStack_2410;
    uStack_21a0._4_4_ = (float)((ulong)uStack_2410 >> 0x20);
    local_2188 = local_2158 + (float)local_21a8;
    fStack_2184 = fStack_2154 + local_21a8._4_4_;
    fStack_2180 = fStack_2150 + (float)uStack_21a0;
    fStack_217c = fStack_214c + uStack_21a0._4_4_;
    local_2298 = &local_22d8;
    local_2218._0_4_ = (float)local_40d8;
    local_2218._4_4_ = (float)((ulong)local_40d8 >> 0x20);
    uStack_2210._0_4_ = (float)uStack_40d0;
    uStack_2210._4_4_ = (float)((ulong)uStack_40d0 >> 0x20);
    local_2238 = local_23b4 * (float)local_2218;
    fStack_2234 = local_23b4 * local_2218._4_4_;
    fStack_2230 = local_23b4 * (float)uStack_2210;
    fStack_222c = local_23b4 * uStack_2210._4_4_;
    local_2278 = CONCAT44(fStack_2234,local_2238);
    uStack_2270 = CONCAT44(fStack_222c,fStack_2230);
    local_2288._0_4_ = (float)local_23f8;
    local_2288._4_4_ = (float)((ulong)local_23f8 >> 0x20);
    uStack_2280._0_4_ = (float)uStack_23f0;
    uStack_2280._4_4_ = (float)((ulong)uStack_23f0 >> 0x20);
    local_2268 = local_2238 + (float)local_2288;
    fStack_2264 = fStack_2234 + local_2288._4_4_;
    fStack_2260 = fStack_2230 + (float)uStack_2280;
    fStack_225c = fStack_222c + uStack_2280._4_4_;
    local_3cd8 = CONCAT44(fStack_2264,local_2268);
    uStack_3cd0 = CONCAT44(fStack_225c,fStack_2260);
    local_26e0 = &local_4118;
    local_26d0 = &local_3408;
    local_26c4 = (float)local_4118;
    local_26c0 = &local_26f8;
    local_2518 = CONCAT44((float)local_4118,(float)local_4118);
    uStack_2510 = CONCAT44((float)local_4118,(float)local_4118);
    local_26b4 = local_4118._4_4_;
    local_26b0 = &local_2718;
    local_2438 = CONCAT44(local_4118._4_4_,local_4118._4_4_);
    uStack_2430 = CONCAT44(local_4118._4_4_,local_4118._4_4_);
    local_24e8 = &local_40c8;
    local_26a4 = (float)uStack_4110;
    local_26a0 = &local_2738;
    local_25f8 = CONCAT44((float)uStack_4110,(float)uStack_4110);
    uStack_25f0 = CONCAT44((float)uStack_4110,(float)uStack_4110);
    local_2640 = &local_40b8;
    local_2630 = &local_2728;
    local_2608 = local_40b8;
    uStack_2600 = uStack_40b0;
    local_2628 = (float)uStack_4110 * (float)local_22f8;
    fStack_2624 = (float)uStack_4110 * local_22f8._4_4_;
    fStack_2620 = (float)uStack_4110 * (float)uStack_22f0;
    fStack_261c = (float)uStack_4110 * uStack_22f0._4_4_;
    local_25d0 = &local_2708;
    local_24c8 = &local_2508;
    local_2448 = local_40c8;
    uStack_2440 = uStack_40c0;
    local_2468 = local_4118._4_4_ * (float)local_2138;
    fStack_2464 = local_4118._4_4_ * local_2138._4_4_;
    fStack_2460 = local_4118._4_4_ * (float)uStack_2130;
    fStack_245c = local_4118._4_4_ * uStack_2130._4_4_;
    local_24a8 = CONCAT44(fStack_2464,local_2468);
    uStack_24a0 = CONCAT44(fStack_245c,fStack_2460);
    local_24b8._0_4_ = (float)local_2728;
    local_24b8._4_4_ = (float)((ulong)local_2728 >> 0x20);
    uStack_24b0._0_4_ = (float)uStack_2720;
    uStack_24b0._4_4_ = (float)((ulong)uStack_2720 >> 0x20);
    local_2498 = local_2468 + (float)local_24b8;
    fStack_2494 = fStack_2464 + local_24b8._4_4_;
    fStack_2490 = fStack_2460 + (float)uStack_24b0;
    fStack_248c = fStack_245c + uStack_24b0._4_4_;
    local_25a8 = &local_25e8;
    local_2528 = local_40d8;
    uStack_2520 = uStack_40d0;
    local_2548 = (float)local_4118 * (float)local_2218;
    fStack_2544 = (float)local_4118 * local_2218._4_4_;
    fStack_2540 = (float)local_4118 * (float)uStack_2210;
    fStack_253c = (float)local_4118 * uStack_2210._4_4_;
    local_2588 = CONCAT44(fStack_2544,local_2548);
    uStack_2580 = CONCAT44(fStack_253c,fStack_2540);
    local_2598._0_4_ = (float)local_2708;
    local_2598._4_4_ = (float)((ulong)local_2708 >> 0x20);
    uStack_2590._0_4_ = (float)uStack_2700;
    uStack_2590._4_4_ = (float)((ulong)uStack_2700 >> 0x20);
    local_2578 = local_2548 + (float)local_2598;
    fStack_2574 = fStack_2544 + local_2598._4_4_;
    fStack_2570 = fStack_2540 + (float)uStack_2590;
    fStack_256c = fStack_253c + uStack_2590._4_4_;
    local_29f0 = &local_4108;
    local_29e0 = &local_3418;
    local_29d4 = (float)local_4108;
    local_29d0 = &local_2a08;
    local_2828 = CONCAT44((float)local_4108,(float)local_4108);
    uStack_2820 = CONCAT44((float)local_4108,(float)local_4108);
    local_29c4 = local_4108._4_4_;
    local_29c0 = &local_2a28;
    local_2748 = CONCAT44(local_4108._4_4_,local_4108._4_4_);
    uStack_2740 = CONCAT44(local_4108._4_4_,local_4108._4_4_);
    local_27f8 = &local_40c8;
    local_29b4 = (float)uStack_4100;
    local_29b0 = &local_2a48;
    local_2908 = CONCAT44((float)uStack_4100,(float)uStack_4100);
    uStack_2900 = CONCAT44((float)uStack_4100,(float)uStack_4100);
    local_2950 = &local_40b8;
    local_2940 = &local_2a38;
    local_2918 = local_40b8;
    uStack_2910 = uStack_40b0;
    local_2938 = (float)uStack_4100 * (float)local_22f8;
    fStack_2934 = (float)uStack_4100 * local_22f8._4_4_;
    fStack_2930 = (float)uStack_4100 * (float)uStack_22f0;
    fStack_292c = (float)uStack_4100 * uStack_22f0._4_4_;
    local_28e0 = &local_2a18;
    local_27d8 = &local_2818;
    local_2758 = local_40c8;
    uStack_2750 = uStack_40c0;
    local_2778 = local_4108._4_4_ * (float)local_2138;
    fStack_2774 = local_4108._4_4_ * local_2138._4_4_;
    fStack_2770 = local_4108._4_4_ * (float)uStack_2130;
    fStack_276c = local_4108._4_4_ * uStack_2130._4_4_;
    local_27b8 = CONCAT44(fStack_2774,local_2778);
    uStack_27b0 = CONCAT44(fStack_276c,fStack_2770);
    local_27c8._0_4_ = (float)local_2a38;
    local_27c8._4_4_ = (float)((ulong)local_2a38 >> 0x20);
    uStack_27c0._0_4_ = (float)uStack_2a30;
    uStack_27c0._4_4_ = (float)((ulong)uStack_2a30 >> 0x20);
    local_27a8 = local_2778 + (float)local_27c8;
    fStack_27a4 = fStack_2774 + local_27c8._4_4_;
    fStack_27a0 = fStack_2770 + (float)uStack_27c0;
    fStack_279c = fStack_276c + uStack_27c0._4_4_;
    local_28b8 = &local_28f8;
    local_2838 = local_40d8;
    uStack_2830 = uStack_40d0;
    local_2858 = (float)local_4108 * (float)local_2218;
    fStack_2854 = (float)local_4108 * local_2218._4_4_;
    fStack_2850 = (float)local_4108 * (float)uStack_2210;
    fStack_284c = (float)local_4108 * uStack_2210._4_4_;
    local_2898 = CONCAT44(fStack_2854,local_2858);
    uStack_2890 = CONCAT44(fStack_284c,fStack_2850);
    local_28a8._0_4_ = (float)local_2a18;
    local_28a8._4_4_ = (float)((ulong)local_2a18 >> 0x20);
    uStack_28a0._0_4_ = (float)uStack_2a10;
    uStack_28a0._4_4_ = (float)((ulong)uStack_2a10 >> 0x20);
    local_2888 = local_2858 + (float)local_28a8;
    fStack_2884 = fStack_2854 + local_28a8._4_4_;
    fStack_2880 = fStack_2850 + (float)uStack_28a0;
    fStack_287c = fStack_284c + uStack_28a0._4_4_;
    local_d98 = &local_3cc8;
    local_da8 = &local_3cb8;
    local_1480 = &local_40f8;
    local_3c88 = &local_3cf8;
    local_1464 = (float)local_40f8;
    local_1460 = &local_1498;
    local_12b8 = CONCAT44((float)local_40f8,(float)local_40f8);
    uStack_12b0 = CONCAT44((float)local_40f8,(float)local_40f8);
    local_1454 = local_40f8._4_4_;
    local_1450 = &local_14b8;
    local_11d8 = CONCAT44(local_40f8._4_4_,local_40f8._4_4_);
    uStack_11d0 = CONCAT44(local_40f8._4_4_,local_40f8._4_4_);
    local_1288 = &local_40c8;
    local_1444 = (float)uStack_40f0;
    local_1440 = &local_14d8;
    local_1398 = CONCAT44((float)uStack_40f0,(float)uStack_40f0);
    uStack_1390 = CONCAT44((float)uStack_40f0,(float)uStack_40f0);
    local_13e0 = &local_40b8;
    local_13d0 = &local_14c8;
    local_13a8 = local_40b8;
    uStack_13a0 = uStack_40b0;
    local_13c8 = (float)uStack_40f0 * (float)local_22f8;
    fStack_13c4 = (float)uStack_40f0 * local_22f8._4_4_;
    fStack_13c0 = (float)uStack_40f0 * (float)uStack_22f0;
    fStack_13bc = (float)uStack_40f0 * uStack_22f0._4_4_;
    local_1370 = &local_14a8;
    local_1268 = &local_12a8;
    local_11e8 = local_40c8;
    uStack_11e0 = uStack_40c0;
    local_1208 = local_40f8._4_4_ * (float)local_2138;
    fStack_1204 = local_40f8._4_4_ * local_2138._4_4_;
    fStack_1200 = local_40f8._4_4_ * (float)uStack_2130;
    fStack_11fc = local_40f8._4_4_ * uStack_2130._4_4_;
    local_1248 = CONCAT44(fStack_1204,local_1208);
    uStack_1240 = CONCAT44(fStack_11fc,fStack_1200);
    local_1258._0_4_ = (float)local_14c8;
    local_1258._4_4_ = (float)((ulong)local_14c8 >> 0x20);
    uStack_1250._0_4_ = (float)uStack_14c0;
    uStack_1250._4_4_ = (float)((ulong)uStack_14c0 >> 0x20);
    local_1238 = local_1208 + (float)local_1258;
    fStack_1234 = fStack_1204 + local_1258._4_4_;
    fStack_1230 = fStack_1200 + (float)uStack_1250;
    fStack_122c = fStack_11fc + uStack_1250._4_4_;
    local_1348 = &local_1388;
    local_12c8 = local_40d8;
    uStack_12c0 = uStack_40d0;
    local_12e8 = (float)local_40f8 * (float)local_2218;
    fStack_12e4 = (float)local_40f8 * local_2218._4_4_;
    fStack_12e0 = (float)local_40f8 * (float)uStack_2210;
    fStack_12dc = (float)local_40f8 * uStack_2210._4_4_;
    local_1328 = CONCAT44(fStack_12e4,local_12e8);
    uStack_1320 = CONCAT44(fStack_12dc,fStack_12e0);
    local_1338._0_4_ = (float)local_14a8;
    local_1338._4_4_ = (float)((ulong)local_14a8 >> 0x20);
    uStack_1330._0_4_ = (float)uStack_14a0;
    uStack_1330._4_4_ = (float)((ulong)uStack_14a0 >> 0x20);
    local_1318 = local_12e8 + (float)local_1338;
    fStack_1314 = fStack_12e4 + local_1338._4_4_;
    fStack_1310 = fStack_12e0 + (float)uStack_1330;
    fStack_130c = fStack_12dc + uStack_1330._4_4_;
    local_3958 = CONCAT44(fStack_1314,local_1318);
    uStack_3950 = CONCAT44(fStack_130c,fStack_1310);
    local_3c90 = &local_40a8;
    local_3c80 = &local_3ce8;
    local_3968._0_4_ = (float)local_40a8;
    local_3968._4_4_ = (float)((ulong)local_40a8 >> 0x20);
    uStack_3960._0_4_ = (float)uStack_40a0;
    uStack_3960._4_4_ = (float)((ulong)uStack_40a0 >> 0x20);
    local_38e8 = local_1318 + (float)local_3968;
    fStack_38e4 = fStack_1314 + local_3968._4_4_;
    fStack_38e0 = fStack_1310 + (float)uStack_3960;
    fStack_38dc = fStack_130c + uStack_3960._4_4_;
    local_c80 = &local_4088;
    local_c90 = &local_4078;
    local_c88 = &local_3cc8;
    local_c98 = &local_3cb8;
    local_d38 = &local_4068;
    local_3b58 = &local_4178;
    local_3798 = local_4040;
    local_374c = 0x80000000;
    local_372c = 0x80000000;
    local_3730 = 0x80000000;
    local_3734 = 0x80000000;
    local_3738 = 0x80000000;
    local_37a8 = 0x8000000080000000;
    uStack_37a0 = 0x8000000080000000;
    local_3718 = *local_4040;
    uStack_3710 = local_4040[1];
    local_3788 = local_3718 ^ 0x8000000080000000;
    uStack_3780 = uStack_3710 ^ 0x8000000080000000;
    local_3d28 = &local_4168;
    local_e98 = &local_3b88;
    local_b0 = &one;
    local_68 = &zero;
    local_70 = &zero;
    local_164 = 0x3f800000;
    local_168 = 0;
    local_16c = 0;
    local_c4 = 0;
    local_c8 = 0;
    local_cc = 0;
    local_d0 = 0x3f800000;
    local_e8 = 0x3f800000;
    uStack_e0 = 0;
    local_3b88 = 0x3f800000;
    uStack_3b80 = 0;
    local_148 = &local_3b78;
    local_78 = &zero;
    local_b8 = &one;
    local_80 = &zero;
    local_14c = 0;
    local_150 = 0x3f800000;
    local_154 = 0;
    local_ec = 0;
    local_f0 = 0;
    local_f4 = 0x3f800000;
    local_f8 = 0;
    local_108 = 0x3f80000000000000;
    uStack_100 = 0;
    local_3b78 = 0x3f80000000000000;
    uStack_3b70 = 0;
    local_130 = &local_3b68;
    local_88 = &zero;
    local_90 = &zero;
    local_c0 = &one;
    local_134 = 0;
    local_138 = 0;
    local_13c = 0x3f800000;
    local_10c = 0;
    local_110 = 0x3f800000;
    local_114 = 0;
    local_118 = 0;
    local_128 = 0;
    uStack_120 = 0x3f800000;
    local_3b68 = 0;
    uStack_3b60 = 0x3f800000;
    local_bd0 = &local_4158;
    local_be0 = &local_4148;
    local_bd8 = &local_3b78;
    local_be8 = &local_3b68;
    local_d18 = &local_4138;
    local_3380 = &local_3d58;
    local_2cf0 = &local_33a8;
    local_2ce4 = 0x3f800000;
    local_2ce0 = &local_2d18;
    local_2b38 = 0x3f8000003f800000;
    uStack_2b30 = 0x3f8000003f800000;
    local_2cd4 = local_4168._4_4_;
    local_2cd0 = &local_2d38;
    local_2a58 = CONCAT44(local_4168._4_4_,local_4168._4_4_);
    uStack_2a50 = CONCAT44(local_4168._4_4_,local_4168._4_4_);
    local_2b08 = &local_4088;
    local_2cc4 = (float)uStack_4160;
    local_2cc0 = &local_2d58;
    local_2c18 = CONCAT44((float)uStack_4160,(float)uStack_4160);
    uStack_2c10 = CONCAT44((float)uStack_4160,(float)uStack_4160);
    local_2c60 = &local_4078;
    local_2c50 = &local_2d48;
    local_2c28._0_4_ = (float)local_4078;
    local_2c28._4_4_ = (float)((ulong)local_4078 >> 0x20);
    uStack_2c20._0_4_ = (float)uStack_4070;
    uStack_2c20._4_4_ = (float)((ulong)uStack_4070 >> 0x20);
    local_2c48 = (float)uStack_4160 * (float)local_2c28;
    fStack_2c44 = (float)uStack_4160 * local_2c28._4_4_;
    fStack_2c40 = (float)uStack_4160 * (float)uStack_2c20;
    fStack_2c3c = (float)uStack_4160 * uStack_2c20._4_4_;
    local_2bf0 = &local_2d28;
    local_2ae8 = &local_2b28;
    local_2a68._0_4_ = (float)local_4088;
    local_2a68._4_4_ = (float)((ulong)local_4088 >> 0x20);
    uStack_2a60._0_4_ = (float)uStack_4080;
    uStack_2a60._4_4_ = (float)((ulong)uStack_4080 >> 0x20);
    local_2a88 = local_4168._4_4_ * (float)local_2a68;
    fStack_2a84 = local_4168._4_4_ * local_2a68._4_4_;
    fStack_2a80 = local_4168._4_4_ * (float)uStack_2a60;
    fStack_2a7c = local_4168._4_4_ * uStack_2a60._4_4_;
    local_2ac8 = CONCAT44(fStack_2a84,local_2a88);
    uStack_2ac0 = CONCAT44(fStack_2a7c,fStack_2a80);
    local_2ad8._0_4_ = (float)local_2d48;
    local_2ad8._4_4_ = (float)((ulong)local_2d48 >> 0x20);
    uStack_2ad0._0_4_ = (float)uStack_2d40;
    uStack_2ad0._4_4_ = (float)((ulong)uStack_2d40 >> 0x20);
    local_2ab8 = local_2a88 + (float)local_2ad8;
    fStack_2ab4 = fStack_2a84 + local_2ad8._4_4_;
    fStack_2ab0 = fStack_2a80 + (float)uStack_2ad0;
    fStack_2aac = fStack_2a7c + uStack_2ad0._4_4_;
    local_2bc8 = &local_2c08;
    local_2b48._0_4_ = (float)local_4098;
    local_2b48._4_4_ = (float)((ulong)local_4098 >> 0x20);
    uStack_2b40._0_4_ = (float)uStack_4090;
    uStack_2b40._4_4_ = (float)((ulong)uStack_4090 >> 0x20);
    local_2b68 = (float)local_2b48 * 1.0;
    fStack_2b64 = local_2b48._4_4_ * 1.0;
    fStack_2b60 = (float)uStack_2b40 * 1.0;
    fStack_2b5c = uStack_2b40._4_4_ * 1.0;
    local_2ba8 = CONCAT44(fStack_2b64,local_2b68);
    uStack_2ba0 = CONCAT44(fStack_2b5c,fStack_2b60);
    local_2bb8._0_4_ = (float)local_2d28;
    local_2bb8._4_4_ = (float)((ulong)local_2d28 >> 0x20);
    uStack_2bb0._0_4_ = (float)uStack_2d20;
    uStack_2bb0._4_4_ = (float)((ulong)uStack_2d20 >> 0x20);
    local_2b98 = local_2b68 + (float)local_2bb8;
    fStack_2b94 = fStack_2b64 + local_2bb8._4_4_;
    fStack_2b90 = fStack_2b60 + (float)uStack_2bb0;
    fStack_2b8c = fStack_2b5c + uStack_2bb0._4_4_;
    local_3d58 = CONCAT44(fStack_2b94,local_2b98);
    uStack_3d50 = CONCAT44(fStack_2b8c,fStack_2b90);
    local_3010 = &local_4158;
    local_3000 = &local_33b8;
    local_2ff4 = (float)local_4158;
    local_2ff0 = &local_3028;
    local_2e48 = CONCAT44((float)local_4158,(float)local_4158);
    uStack_2e40 = CONCAT44((float)local_4158,(float)local_4158);
    local_2fe4 = local_4158._4_4_;
    local_2fe0 = &local_3048;
    local_2d68 = CONCAT44(local_4158._4_4_,local_4158._4_4_);
    uStack_2d60 = CONCAT44(local_4158._4_4_,local_4158._4_4_);
    local_2e18 = &local_4088;
    local_2fd4 = (float)uStack_4150;
    local_2fd0 = &local_3068;
    local_2f28 = CONCAT44((float)uStack_4150,(float)uStack_4150);
    uStack_2f20 = CONCAT44((float)uStack_4150,(float)uStack_4150);
    local_2f70 = &local_4078;
    local_2f60 = &local_3058;
    local_2f38 = local_4078;
    uStack_2f30 = uStack_4070;
    local_2f58 = (float)uStack_4150 * (float)local_2c28;
    fStack_2f54 = (float)uStack_4150 * local_2c28._4_4_;
    fStack_2f50 = (float)uStack_4150 * (float)uStack_2c20;
    fStack_2f4c = (float)uStack_4150 * uStack_2c20._4_4_;
    local_2f00 = &local_3038;
    local_2df8 = &local_2e38;
    local_2d78 = local_4088;
    uStack_2d70 = uStack_4080;
    local_2d98 = local_4158._4_4_ * (float)local_2a68;
    fStack_2d94 = local_4158._4_4_ * local_2a68._4_4_;
    fStack_2d90 = local_4158._4_4_ * (float)uStack_2a60;
    fStack_2d8c = local_4158._4_4_ * uStack_2a60._4_4_;
    local_2dd8 = CONCAT44(fStack_2d94,local_2d98);
    uStack_2dd0 = CONCAT44(fStack_2d8c,fStack_2d90);
    local_2de8._0_4_ = (float)local_3058;
    local_2de8._4_4_ = (float)((ulong)local_3058 >> 0x20);
    uStack_2de0._0_4_ = (float)uStack_3050;
    uStack_2de0._4_4_ = (float)((ulong)uStack_3050 >> 0x20);
    local_2dc8 = local_2d98 + (float)local_2de8;
    fStack_2dc4 = fStack_2d94 + local_2de8._4_4_;
    fStack_2dc0 = fStack_2d90 + (float)uStack_2de0;
    fStack_2dbc = fStack_2d8c + uStack_2de0._4_4_;
    local_2ed8 = &local_2f18;
    local_2e58 = local_4098;
    uStack_2e50 = uStack_4090;
    local_2e78 = (float)local_4158 * (float)local_2b48;
    fStack_2e74 = (float)local_4158 * local_2b48._4_4_;
    fStack_2e70 = (float)local_4158 * (float)uStack_2b40;
    fStack_2e6c = (float)local_4158 * uStack_2b40._4_4_;
    local_2eb8 = CONCAT44(fStack_2e74,local_2e78);
    uStack_2eb0 = CONCAT44(fStack_2e6c,fStack_2e70);
    local_2ec8._0_4_ = (float)local_3038;
    local_2ec8._4_4_ = (float)((ulong)local_3038 >> 0x20);
    uStack_2ec0._0_4_ = (float)uStack_3030;
    uStack_2ec0._4_4_ = (float)((ulong)uStack_3030 >> 0x20);
    local_2ea8 = local_2e78 + (float)local_2ec8;
    fStack_2ea4 = fStack_2e74 + local_2ec8._4_4_;
    fStack_2ea0 = fStack_2e70 + (float)uStack_2ec0;
    fStack_2e9c = fStack_2e6c + uStack_2ec0._4_4_;
    local_3320 = &local_4148;
    local_3310 = &local_33c8;
    local_3304 = (float)local_4148;
    local_3300 = &local_3338;
    local_3158 = CONCAT44((float)local_4148,(float)local_4148);
    uStack_3150 = CONCAT44((float)local_4148,(float)local_4148);
    local_32f4 = local_4148._4_4_;
    local_32f0 = &local_3358;
    local_3078 = CONCAT44(local_4148._4_4_,local_4148._4_4_);
    uStack_3070 = CONCAT44(local_4148._4_4_,local_4148._4_4_);
    local_3128 = &local_4088;
    local_32e4 = (float)uStack_4140;
    local_32e0 = &local_3378;
    local_3238 = CONCAT44((float)uStack_4140,(float)uStack_4140);
    uStack_3230 = CONCAT44((float)uStack_4140,(float)uStack_4140);
    local_3280 = &local_4078;
    local_3270 = &local_3368;
    local_3248 = local_4078;
    uStack_3240 = uStack_4070;
    local_3268 = (float)uStack_4140 * (float)local_2c28;
    fStack_3264 = (float)uStack_4140 * local_2c28._4_4_;
    fStack_3260 = (float)uStack_4140 * (float)uStack_2c20;
    fStack_325c = (float)uStack_4140 * uStack_2c20._4_4_;
    local_3210 = &local_3348;
    local_3108 = &local_3148;
    local_3088 = local_4088;
    uStack_3080 = uStack_4080;
    local_30a8 = local_4148._4_4_ * (float)local_2a68;
    fStack_30a4 = local_4148._4_4_ * local_2a68._4_4_;
    fStack_30a0 = local_4148._4_4_ * (float)uStack_2a60;
    fStack_309c = local_4148._4_4_ * uStack_2a60._4_4_;
    local_30e8 = CONCAT44(fStack_30a4,local_30a8);
    uStack_30e0 = CONCAT44(fStack_309c,fStack_30a0);
    local_30f8._0_4_ = (float)local_3368;
    local_30f8._4_4_ = (float)((ulong)local_3368 >> 0x20);
    uStack_30f0._0_4_ = (float)uStack_3360;
    uStack_30f0._4_4_ = (float)((ulong)uStack_3360 >> 0x20);
    local_30d8 = local_30a8 + (float)local_30f8;
    fStack_30d4 = fStack_30a4 + local_30f8._4_4_;
    fStack_30d0 = fStack_30a0 + (float)uStack_30f0;
    fStack_30cc = fStack_309c + uStack_30f0._4_4_;
    local_31e8 = &local_3228;
    local_3168 = local_4098;
    uStack_3160 = uStack_4090;
    local_3188 = (float)local_4148 * (float)local_2b48;
    fStack_3184 = (float)local_4148 * local_2b48._4_4_;
    fStack_3180 = (float)local_4148 * (float)uStack_2b40;
    fStack_317c = (float)local_4148 * uStack_2b40._4_4_;
    local_31c8 = CONCAT44(fStack_3184,local_3188);
    uStack_31c0 = CONCAT44(fStack_317c,fStack_3180);
    local_31d8._0_4_ = (float)local_3348;
    local_31d8._4_4_ = (float)((ulong)local_3348 >> 0x20);
    uStack_31d0._0_4_ = (float)uStack_3340;
    uStack_31d0._4_4_ = (float)((ulong)uStack_3340 >> 0x20);
    local_31b8 = local_3188 + (float)local_31d8;
    fStack_31b4 = fStack_3184 + local_31d8._4_4_;
    fStack_31b0 = fStack_3180 + (float)uStack_31d0;
    fStack_31ac = fStack_317c + uStack_31d0._4_4_;
    local_d68 = &local_3d48;
    local_d78 = &local_3d38;
    local_1170 = &local_4138;
    local_3d08 = &local_3d78;
    local_1154 = (float)local_4138;
    local_1150 = &local_1188;
    local_fa8 = CONCAT44((float)local_4138,(float)local_4138);
    uStack_fa0 = CONCAT44((float)local_4138,(float)local_4138);
    local_1144 = local_4138._4_4_;
    local_1140 = &local_11a8;
    local_ec8 = CONCAT44(local_4138._4_4_,local_4138._4_4_);
    uStack_ec0 = CONCAT44(local_4138._4_4_,local_4138._4_4_);
    local_f78 = &local_4088;
    local_1134 = (float)uStack_4130;
    local_1130 = &local_11c8;
    local_1088 = CONCAT44((float)uStack_4130,(float)uStack_4130);
    uStack_1080 = CONCAT44((float)uStack_4130,(float)uStack_4130);
    local_10d0 = &local_4078;
    local_10c0 = &local_11b8;
    local_1098 = local_4078;
    uStack_1090 = uStack_4070;
    local_10b8 = (float)uStack_4130 * (float)local_2c28;
    fStack_10b4 = (float)uStack_4130 * local_2c28._4_4_;
    fStack_10b0 = (float)uStack_4130 * (float)uStack_2c20;
    fStack_10ac = (float)uStack_4130 * uStack_2c20._4_4_;
    local_1060 = &local_1198;
    local_f58 = &local_f98;
    local_ed8 = local_4088;
    uStack_ed0 = uStack_4080;
    local_ef8 = local_4138._4_4_ * (float)local_2a68;
    fStack_ef4 = local_4138._4_4_ * local_2a68._4_4_;
    fStack_ef0 = local_4138._4_4_ * (float)uStack_2a60;
    fStack_eec = local_4138._4_4_ * uStack_2a60._4_4_;
    local_f38 = CONCAT44(fStack_ef4,local_ef8);
    uStack_f30 = CONCAT44(fStack_eec,fStack_ef0);
    local_f48._0_4_ = (float)local_11b8;
    local_f48._4_4_ = (float)((ulong)local_11b8 >> 0x20);
    uStack_f40._0_4_ = (float)uStack_11b0;
    uStack_f40._4_4_ = (float)((ulong)uStack_11b0 >> 0x20);
    local_f28 = local_ef8 + (float)local_f48;
    fStack_f24 = fStack_ef4 + local_f48._4_4_;
    fStack_f20 = fStack_ef0 + (float)uStack_f40;
    fStack_f1c = fStack_eec + uStack_f40._4_4_;
    local_1038 = &local_1078;
    local_fb8 = local_4098;
    uStack_fb0 = uStack_4090;
    local_fd8 = (float)local_4138 * (float)local_2b48;
    fStack_fd4 = (float)local_4138 * local_2b48._4_4_;
    fStack_fd0 = (float)local_4138 * (float)uStack_2b40;
    fStack_fcc = (float)local_4138 * uStack_2b40._4_4_;
    local_1018 = CONCAT44(fStack_fd4,local_fd8);
    uStack_1010 = CONCAT44(fStack_fcc,fStack_fd0);
    local_1028._0_4_ = (float)local_1198;
    local_1028._4_4_ = (float)((ulong)local_1198 >> 0x20);
    uStack_1020._0_4_ = (float)uStack_1190;
    uStack_1020._4_4_ = (float)((ulong)uStack_1190 >> 0x20);
    local_1008 = local_fd8 + (float)local_1028;
    fStack_1004 = fStack_fd4 + local_1028._4_4_;
    fStack_1000 = fStack_fd0 + (float)uStack_1020;
    fStack_ffc = fStack_fcc + uStack_1020._4_4_;
    local_3938 = CONCAT44(fStack_1004,local_1008);
    uStack_3930 = CONCAT44(fStack_ffc,fStack_1000);
    local_3d10 = &local_4068;
    local_3d00 = &local_3d68;
    local_3948._0_4_ = (float)local_4068;
    local_3948._4_4_ = (float)((ulong)local_4068 >> 0x20);
    uStack_3940._0_4_ = (float)uStack_4060;
    uStack_3940._4_4_ = (float)((ulong)uStack_4060 >> 0x20);
    local_38c8 = local_1008 + (float)local_3948;
    fStack_38c4 = fStack_1004 + local_3948._4_4_;
    fStack_38c0 = fStack_1000 + (float)uStack_3940;
    fStack_38bc = fStack_ffc + uStack_3940._4_4_;
    local_cd8 = &local_41d8;
    local_ce8 = &local_41c8;
    local_ce0 = &local_3d48;
    local_cf0 = &local_3d38;
    local_d48 = &local_41b8;
    local_3ff0 = &local_4268;
    local_3ff4 = 0x40000000;
    local_3ff8 = 0x3f800000;
    local_3ffc = 0x3f800000;
    local_39cc = 0;
    local_39d0 = 0x3f800000;
    local_39d4 = 0x3f800000;
    local_39d8 = 0x40000000;
    local_39e8 = 0x3f80000040000000;
    uStack_39e0 = 0x3f800000;
    local_4268 = 0x3f80000040000000;
    uStack_4260 = 0x3f800000;
    local_3d80 = &local_4258;
    local_558 = &local_3db8;
    local_334 = 0;
    local_338 = 0;
    local_33c = 0;
    local_300 = (long)&local_4268 + 4;
    local_340 = 0;
    local_344 = 0;
    local_348 = 0;
    local_320 = &uStack_4260;
    local_2e8 = &local_334;
    local_2f0 = &local_338;
    local_2f8 = &local_33c;
    local_308 = &local_340;
    local_310 = &local_344;
    local_318 = &local_348;
    local_2c4 = 0x40000000;
    local_2c8 = 0;
    local_2cc = 0;
    local_22c = 0;
    local_248 = 0x40000000;
    uStack_240 = 0;
    local_2a8 = &local_3da8;
    local_2ac = 0;
    local_2b0 = 0x3f800000;
    local_2b4 = 0;
    local_24c = 0;
    local_268 = 0x3f80000000000000;
    uStack_260 = 0;
    local_290 = &local_3d98;
    local_294 = 0;
    local_298 = 0;
    local_29c = 0x3f800000;
    local_26c = 0;
    local_288 = 0;
    uStack_280 = 0x3f800000;
    local_428 = &local_4248;
    local_420 = &local_4238;
    local_538 = &local_4228;
    local_3d8 = &local_3da8;
    local_3d0 = &local_4248;
    local_3e8 = &local_3d98;
    local_3e0 = &local_4238;
    local_378 = &local_568;
    local_358 = 0;
    uStack_350 = 0;
    local_568 = 0;
    uStack_560 = 0;
    local_540 = &local_4228;
    local_548 = &local_568;
    for (local_426c = 0; uVar2 = local_4288, local_426c < 8; local_426c = local_426c + 1) {
      lVar6 = (long)local_426c * 0x10;
      local_3fdc = *(undefined4 *)(cube_vertices + lVar6);
      local_3fe0 = *(undefined4 *)(cube_vertices + lVar6 + 4);
      local_3a08 = *(undefined8 *)(cube_vertices + lVar6);
      local_3fe4 = *(uint *)(cube_vertices + lVar6 + 8);
      local_3fd8 = &local_4288;
      local_39ec = 0;
      uStack_3a00 = (ulong)local_3fe4;
      local_3e98 = &local_42e8;
      local_3c20 = local_41f8 + 2;
      local_3c28 = &local_4258;
      local_3420 = &local_3c58;
      local_1a90 = &local_3448;
      local_1a84 = 0x40000000;
      local_1a80 = &local_1ab8;
      local_18d8 = 0x4000000040000000;
      uStack_18d0 = 0x4000000040000000;
      local_1a74 = local_4258._4_4_;
      local_1a70 = &local_1ad8;
      local_17f8 = CONCAT44(local_4258._4_4_,local_4258._4_4_);
      uStack_17f0 = CONCAT44(local_4258._4_4_,local_4258._4_4_);
      local_18a8 = &local_41d8;
      local_1a64 = (float)uStack_4250;
      local_1a60 = &local_1af8;
      local_19b8 = CONCAT44((float)uStack_4250,(float)uStack_4250);
      uStack_19b0 = CONCAT44((float)uStack_4250,(float)uStack_4250);
      local_1a00 = &local_41c8;
      local_19f0 = &local_1ae8;
      local_19c8._0_4_ = (float)local_41c8;
      local_19c8._4_4_ = (float)((ulong)local_41c8 >> 0x20);
      uStack_19c0._0_4_ = (float)uStack_41c0;
      uStack_19c0._4_4_ = (float)((ulong)uStack_41c0 >> 0x20);
      local_19e8 = (float)uStack_4250 * (float)local_19c8;
      fStack_19e4 = (float)uStack_4250 * local_19c8._4_4_;
      fStack_19e0 = (float)uStack_4250 * (float)uStack_19c0;
      fStack_19dc = (float)uStack_4250 * uStack_19c0._4_4_;
      local_1990 = &local_1ac8;
      local_1888 = &local_18c8;
      local_1808._0_4_ = (float)local_41d8;
      local_1808._4_4_ = (float)((ulong)local_41d8 >> 0x20);
      uStack_1800._0_4_ = (float)uStack_41d0;
      uStack_1800._4_4_ = (float)((ulong)uStack_41d0 >> 0x20);
      local_1828 = local_4258._4_4_ * (float)local_1808;
      fStack_1824 = local_4258._4_4_ * local_1808._4_4_;
      fStack_1820 = local_4258._4_4_ * (float)uStack_1800;
      fStack_181c = local_4258._4_4_ * uStack_1800._4_4_;
      local_1868 = CONCAT44(fStack_1824,local_1828);
      uStack_1860 = CONCAT44(fStack_181c,fStack_1820);
      local_1878._0_4_ = (float)local_1ae8;
      local_1878._4_4_ = (float)((ulong)local_1ae8 >> 0x20);
      uStack_1870._0_4_ = (float)uStack_1ae0;
      uStack_1870._4_4_ = (float)((ulong)uStack_1ae0 >> 0x20);
      local_1858 = local_1828 + (float)local_1878;
      fStack_1854 = fStack_1824 + local_1878._4_4_;
      fStack_1850 = fStack_1820 + (float)uStack_1870;
      fStack_184c = fStack_181c + uStack_1870._4_4_;
      local_1968 = &local_19a8;
      local_18e8._0_4_ = (float)local_41f8[2];
      local_18e8._4_4_ = (float)(local_41f8[2] >> 0x20);
      uStack_18e0._0_4_ = (float)uStack_41e0;
      uStack_18e0._4_4_ = (float)((ulong)uStack_41e0 >> 0x20);
      local_1908 = (float)local_18e8 * 2.0;
      fStack_1904 = local_18e8._4_4_ * 2.0;
      fStack_1900 = (float)uStack_18e0 * 2.0;
      fStack_18fc = uStack_18e0._4_4_ * 2.0;
      local_1948 = CONCAT44(fStack_1904,local_1908);
      uStack_1940 = CONCAT44(fStack_18fc,fStack_1900);
      local_1958._0_4_ = (float)local_1ac8;
      local_1958._4_4_ = (float)((ulong)local_1ac8 >> 0x20);
      uStack_1950._0_4_ = (float)uStack_1ac0;
      uStack_1950._4_4_ = (float)((ulong)uStack_1ac0 >> 0x20);
      local_1938 = local_1908 + (float)local_1958;
      fStack_1934 = fStack_1904 + local_1958._4_4_;
      fStack_1930 = fStack_1900 + (float)uStack_1950;
      fStack_192c = fStack_18fc + uStack_1950._4_4_;
      local_3c58 = CONCAT44(fStack_1934,local_1938);
      uStack_3c50 = CONCAT44(fStack_192c,fStack_1930);
      local_1db0 = &local_4248;
      local_1da0 = &local_3458;
      local_1d94 = (float)local_4248;
      local_1d90 = &local_1dc8;
      local_1be8 = CONCAT44((float)local_4248,(float)local_4248);
      uStack_1be0 = CONCAT44((float)local_4248,(float)local_4248);
      local_1d84 = local_4248._4_4_;
      local_1d80 = &local_1de8;
      local_1b08 = CONCAT44(local_4248._4_4_,local_4248._4_4_);
      uStack_1b00 = CONCAT44(local_4248._4_4_,local_4248._4_4_);
      local_1bb8 = &local_41d8;
      local_1d74 = (float)uStack_4240;
      local_1d70 = &local_1e08;
      local_1cc8 = CONCAT44((float)uStack_4240,(float)uStack_4240);
      uStack_1cc0 = CONCAT44((float)uStack_4240,(float)uStack_4240);
      local_1d10 = &local_41c8;
      local_1d00 = &local_1df8;
      local_1cd8 = local_41c8;
      uStack_1cd0 = uStack_41c0;
      local_1cf8 = (float)uStack_4240 * (float)local_19c8;
      fStack_1cf4 = (float)uStack_4240 * local_19c8._4_4_;
      fStack_1cf0 = (float)uStack_4240 * (float)uStack_19c0;
      fStack_1cec = (float)uStack_4240 * uStack_19c0._4_4_;
      local_1ca0 = &local_1dd8;
      local_1b98 = &local_1bd8;
      local_1b18 = local_41d8;
      uStack_1b10 = uStack_41d0;
      local_1b38 = local_4248._4_4_ * (float)local_1808;
      fStack_1b34 = local_4248._4_4_ * local_1808._4_4_;
      fStack_1b30 = local_4248._4_4_ * (float)uStack_1800;
      fStack_1b2c = local_4248._4_4_ * uStack_1800._4_4_;
      local_1b78 = CONCAT44(fStack_1b34,local_1b38);
      uStack_1b70 = CONCAT44(fStack_1b2c,fStack_1b30);
      local_1b88._0_4_ = (float)local_1df8;
      local_1b88._4_4_ = (float)((ulong)local_1df8 >> 0x20);
      uStack_1b80._0_4_ = (float)uStack_1df0;
      uStack_1b80._4_4_ = (float)((ulong)uStack_1df0 >> 0x20);
      local_1b68 = local_1b38 + (float)local_1b88;
      fStack_1b64 = fStack_1b34 + local_1b88._4_4_;
      fStack_1b60 = fStack_1b30 + (float)uStack_1b80;
      fStack_1b5c = fStack_1b2c + uStack_1b80._4_4_;
      local_1c78 = &local_1cb8;
      local_1bf8 = local_41f8[2];
      uStack_1bf0 = uStack_41e0;
      local_1c18 = (float)local_4248 * (float)local_18e8;
      fStack_1c14 = (float)local_4248 * local_18e8._4_4_;
      fStack_1c10 = (float)local_4248 * (float)uStack_18e0;
      fStack_1c0c = (float)local_4248 * uStack_18e0._4_4_;
      local_1c58 = CONCAT44(fStack_1c14,local_1c18);
      uStack_1c50 = CONCAT44(fStack_1c0c,fStack_1c10);
      local_1c68._0_4_ = (float)local_1dd8;
      local_1c68._4_4_ = (float)((ulong)local_1dd8 >> 0x20);
      uStack_1c60._0_4_ = (float)uStack_1dd0;
      uStack_1c60._4_4_ = (float)((ulong)uStack_1dd0 >> 0x20);
      local_1c48 = local_1c18 + (float)local_1c68;
      fStack_1c44 = fStack_1c14 + local_1c68._4_4_;
      fStack_1c40 = fStack_1c10 + (float)uStack_1c60;
      fStack_1c3c = fStack_1c0c + uStack_1c60._4_4_;
      local_20c0 = &local_4238;
      local_20b0 = &local_3468;
      local_20a4 = (float)local_4238;
      local_20a0 = &local_20d8;
      local_1ef8 = CONCAT44((float)local_4238,(float)local_4238);
      uStack_1ef0 = CONCAT44((float)local_4238,(float)local_4238);
      local_2094 = local_4238._4_4_;
      local_2090 = &local_20f8;
      local_1e18 = CONCAT44(local_4238._4_4_,local_4238._4_4_);
      uStack_1e10 = CONCAT44(local_4238._4_4_,local_4238._4_4_);
      local_1ec8 = &local_41d8;
      local_2084 = (float)uStack_4230;
      local_2080 = &local_2118;
      local_1fd8 = CONCAT44((float)uStack_4230,(float)uStack_4230);
      uStack_1fd0 = CONCAT44((float)uStack_4230,(float)uStack_4230);
      local_2020 = &local_41c8;
      local_2010 = &local_2108;
      local_1fe8 = local_41c8;
      uStack_1fe0 = uStack_41c0;
      local_2008 = (float)uStack_4230 * (float)local_19c8;
      fStack_2004 = (float)uStack_4230 * local_19c8._4_4_;
      fStack_2000 = (float)uStack_4230 * (float)uStack_19c0;
      fStack_1ffc = (float)uStack_4230 * uStack_19c0._4_4_;
      local_1fb0 = &local_20e8;
      local_1ea8 = &local_1ee8;
      local_1e28 = local_41d8;
      uStack_1e20 = uStack_41d0;
      local_1e48 = local_4238._4_4_ * (float)local_1808;
      fStack_1e44 = local_4238._4_4_ * local_1808._4_4_;
      fStack_1e40 = local_4238._4_4_ * (float)uStack_1800;
      fStack_1e3c = local_4238._4_4_ * uStack_1800._4_4_;
      local_1e88 = CONCAT44(fStack_1e44,local_1e48);
      uStack_1e80 = CONCAT44(fStack_1e3c,fStack_1e40);
      local_1e98._0_4_ = (float)local_2108;
      local_1e98._4_4_ = (float)((ulong)local_2108 >> 0x20);
      uStack_1e90._0_4_ = (float)uStack_2100;
      uStack_1e90._4_4_ = (float)((ulong)uStack_2100 >> 0x20);
      local_1e78 = local_1e48 + (float)local_1e98;
      fStack_1e74 = fStack_1e44 + local_1e98._4_4_;
      fStack_1e70 = fStack_1e40 + (float)uStack_1e90;
      fStack_1e6c = fStack_1e3c + uStack_1e90._4_4_;
      local_1f88 = &local_1fc8;
      local_1f08 = local_41f8[2];
      uStack_1f00 = uStack_41e0;
      local_1f28 = (float)local_4238 * (float)local_18e8;
      fStack_1f24 = (float)local_4238 * local_18e8._4_4_;
      fStack_1f20 = (float)local_4238 * (float)uStack_18e0;
      fStack_1f1c = (float)local_4238 * uStack_18e0._4_4_;
      local_1f68 = CONCAT44(fStack_1f24,local_1f28);
      uStack_1f60 = CONCAT44(fStack_1f1c,fStack_1f20);
      local_1f78._0_4_ = (float)local_20e8;
      local_1f78._4_4_ = (float)((ulong)local_20e8 >> 0x20);
      uStack_1f70._0_4_ = (float)uStack_20e0;
      uStack_1f70._4_4_ = (float)((ulong)uStack_20e0 >> 0x20);
      local_1f58 = local_1f28 + (float)local_1f78;
      fStack_1f54 = fStack_1f24 + local_1f78._4_4_;
      fStack_1f50 = fStack_1f20 + (float)uStack_1f70;
      fStack_1f4c = fStack_1f1c + uStack_1f70._4_4_;
      local_dc8 = &local_3c48;
      local_dd8 = &local_3c38;
      local_1790 = &local_4228;
      local_3c08 = &local_3c78;
      local_1774 = (float)local_4228;
      local_1770 = &local_17a8;
      local_15c8 = CONCAT44((float)local_4228,(float)local_4228);
      uStack_15c0 = CONCAT44((float)local_4228,(float)local_4228);
      local_1764 = local_4228._4_4_;
      local_1760 = &local_17c8;
      local_14e8 = CONCAT44(local_4228._4_4_,local_4228._4_4_);
      uStack_14e0 = CONCAT44(local_4228._4_4_,local_4228._4_4_);
      local_1598 = &local_41d8;
      local_1754 = (float)uStack_4220;
      local_1750 = &local_17e8;
      local_16a8 = CONCAT44((float)uStack_4220,(float)uStack_4220);
      uStack_16a0 = CONCAT44((float)uStack_4220,(float)uStack_4220);
      local_16f0 = &local_41c8;
      local_16e0 = &local_17d8;
      local_16b8 = local_41c8;
      uStack_16b0 = uStack_41c0;
      local_16d8 = (float)uStack_4220 * (float)local_19c8;
      fStack_16d4 = (float)uStack_4220 * local_19c8._4_4_;
      fStack_16d0 = (float)uStack_4220 * (float)uStack_19c0;
      fStack_16cc = (float)uStack_4220 * uStack_19c0._4_4_;
      local_1680 = &local_17b8;
      local_1578 = &local_15b8;
      local_14f8 = local_41d8;
      uStack_14f0 = uStack_41d0;
      local_1518 = local_4228._4_4_ * (float)local_1808;
      fStack_1514 = local_4228._4_4_ * local_1808._4_4_;
      fStack_1510 = local_4228._4_4_ * (float)uStack_1800;
      fStack_150c = local_4228._4_4_ * uStack_1800._4_4_;
      local_1558 = CONCAT44(fStack_1514,local_1518);
      uStack_1550 = CONCAT44(fStack_150c,fStack_1510);
      local_1568._0_4_ = (float)local_17d8;
      local_1568._4_4_ = (float)((ulong)local_17d8 >> 0x20);
      uStack_1560._0_4_ = (float)uStack_17d0;
      uStack_1560._4_4_ = (float)((ulong)uStack_17d0 >> 0x20);
      local_1548 = local_1518 + (float)local_1568;
      fStack_1544 = fStack_1514 + local_1568._4_4_;
      fStack_1540 = fStack_1510 + (float)uStack_1560;
      fStack_153c = fStack_150c + uStack_1560._4_4_;
      local_1658 = &local_1698;
      local_15d8 = local_41f8[2];
      uStack_15d0 = uStack_41e0;
      local_15f8 = (float)local_4228 * (float)local_18e8;
      fStack_15f4 = (float)local_4228 * local_18e8._4_4_;
      fStack_15f0 = (float)local_4228 * (float)uStack_18e0;
      fStack_15ec = (float)local_4228 * uStack_18e0._4_4_;
      local_1638 = CONCAT44(fStack_15f4,local_15f8);
      uStack_1630 = CONCAT44(fStack_15ec,fStack_15f0);
      local_1648._0_4_ = (float)local_17b8;
      local_1648._4_4_ = (float)((ulong)local_17b8 >> 0x20);
      uStack_1640._0_4_ = (float)uStack_17b0;
      uStack_1640._4_4_ = (float)((ulong)uStack_17b0 >> 0x20);
      local_1628 = local_15f8 + (float)local_1648;
      fStack_1624 = fStack_15f4 + local_1648._4_4_;
      fStack_1620 = fStack_15f0 + (float)uStack_1640;
      fStack_161c = fStack_15ec + uStack_1640._4_4_;
      local_3978 = CONCAT44(fStack_1624,local_1628);
      uStack_3970 = CONCAT44(fStack_161c,fStack_1620);
      local_3c10 = &local_41b8;
      local_3c00 = &local_3c68;
      local_3988._0_4_ = (float)local_41b8;
      local_3988._4_4_ = (float)((ulong)local_41b8 >> 0x20);
      uStack_3980._0_4_ = (float)uStack_41b0;
      uStack_3980._4_4_ = (float)((ulong)uStack_41b0 >> 0x20);
      local_3908 = local_1628 + (float)local_3988;
      fStack_3904 = fStack_1624 + local_3988._4_4_;
      fStack_3900 = fStack_1620 + (float)uStack_3980;
      fStack_38fc = fStack_161c + uStack_3980._4_4_;
      local_c28 = &local_42d8;
      local_c38 = &local_42c8;
      local_c30 = &local_3c48;
      local_c40 = &local_3c38;
      local_d28 = &local_42b8;
      local_3e90 = &local_42a8;
      local_4288._0_4_ = (float)local_3a08;
      local_3bd4 = (float)local_4288;
      local_3bd0 = &local_3eb8;
      local_3638 = CONCAT44((float)local_4288,(float)local_4288);
      uStack_3630 = CONCAT44((float)local_4288,(float)local_4288);
      local_4288._4_4_ = SUB84(uVar2,4);
      local_3be4 = local_4288._4_4_;
      local_3be0 = &local_3ed8;
      local_3558 = CONCAT44(local_4288._4_4_,local_4288._4_4_);
      uStack_3550 = CONCAT44(local_4288._4_4_,local_4288._4_4_);
      local_3608 = &local_42d8;
      local_3bf4 = (float)uStack_4280;
      local_3bf0 = &local_3ef8;
      local_3478 = CONCAT44((float)uStack_4280,(float)uStack_4280);
      uStack_3470 = CONCAT44((float)uStack_4280,(float)uStack_4280);
      local_3528 = &local_42c8;
      local_3530 = &local_42b8;
      local_3518 = &local_3ee8;
      local_3520 = &local_3ef8;
      local_34b0 = &local_3548;
      local_3488._0_4_ = (float)local_42c8;
      local_3488._4_4_ = (float)((ulong)local_42c8 >> 0x20);
      uStack_3480._0_4_ = (float)uStack_42c0;
      uStack_3480._4_4_ = (float)((ulong)uStack_42c0 >> 0x20);
      local_34a8 = (float)uStack_4280 * (float)local_3488;
      fStack_34a4 = (float)uStack_4280 * local_3488._4_4_;
      fStack_34a0 = (float)uStack_4280 * (float)uStack_3480;
      fStack_349c = (float)uStack_4280 * uStack_3480._4_4_;
      local_3490 = &local_3548;
      local_34e8 = CONCAT44(fStack_34a4,local_34a8);
      uStack_34e0 = CONCAT44(fStack_349c,fStack_34a0);
      local_3500 = &local_3ee8;
      local_3508 = &local_3548;
      local_34f8._0_4_ = (float)local_42b8;
      local_34f8._4_4_ = (float)((ulong)local_42b8 >> 0x20);
      uStack_34f0._0_4_ = (float)uStack_42b0;
      uStack_34f0._4_4_ = (float)((ulong)uStack_42b0 >> 0x20);
      local_34d8 = local_34a8 + (float)local_34f8;
      fStack_34d4 = fStack_34a4 + local_34f8._4_4_;
      fStack_34d0 = fStack_34a0 + (float)uStack_34f0;
      fStack_34cc = fStack_349c + uStack_34f0._4_4_;
      local_34c8 = &local_3ee8;
      local_35f8 = &local_3ec8;
      local_3600 = &local_3ed8;
      local_3610 = &local_3ee8;
      local_3590 = &local_3628;
      local_3568._0_4_ = (float)local_42d8;
      local_3568._4_4_ = (float)((ulong)local_42d8 >> 0x20);
      uStack_3560._0_4_ = (float)uStack_42d0;
      uStack_3560._4_4_ = (float)((ulong)uStack_42d0 >> 0x20);
      local_3588 = local_4288._4_4_ * (float)local_3568;
      fStack_3584 = local_4288._4_4_ * local_3568._4_4_;
      fStack_3580 = local_4288._4_4_ * (float)uStack_3560;
      fStack_357c = local_4288._4_4_ * uStack_3560._4_4_;
      local_3570 = &local_3628;
      local_35c8 = CONCAT44(fStack_3584,local_3588);
      uStack_35c0 = CONCAT44(fStack_357c,fStack_3580);
      local_35e0 = &local_3ec8;
      local_35e8 = &local_3628;
      local_35d8._0_4_ = (float)local_3ee8;
      local_35d8._4_4_ = (float)((ulong)local_3ee8 >> 0x20);
      uStack_35d0._0_4_ = (float)uStack_3ee0;
      uStack_35d0._4_4_ = (float)((ulong)uStack_3ee0 >> 0x20);
      local_35b8 = local_3588 + (float)local_35d8;
      fStack_35b4 = fStack_3584 + local_35d8._4_4_;
      fStack_35b0 = fStack_3580 + (float)uStack_35d0;
      fStack_35ac = fStack_357c + uStack_35d0._4_4_;
      local_35a8 = &local_3ec8;
      local_36d8 = &local_42a8;
      local_36e0 = &local_3eb8;
      local_36f0 = &local_3ec8;
      local_3670 = &local_3708;
      local_3648._0_4_ = (float)local_42e8;
      local_3648._4_4_ = (float)((ulong)local_42e8 >> 0x20);
      uStack_3640._0_4_ = (float)uStack_42e0;
      uStack_3640._4_4_ = (float)((ulong)uStack_42e0 >> 0x20);
      local_3668 = (float)local_4288 * (float)local_3648;
      fStack_3664 = (float)local_4288 * local_3648._4_4_;
      fStack_3660 = (float)local_4288 * (float)uStack_3640;
      fStack_365c = (float)local_4288 * uStack_3640._4_4_;
      local_3650 = &local_3708;
      local_36a8 = CONCAT44(fStack_3664,local_3668);
      uStack_36a0 = CONCAT44(fStack_365c,fStack_3660);
      local_36c0 = &local_42a8;
      local_36c8 = &local_3708;
      local_36b8._0_4_ = (float)local_3ec8;
      local_36b8._4_4_ = (float)((ulong)local_3ec8 >> 0x20);
      uStack_36b0._0_4_ = (float)uStack_3ec0;
      uStack_36b0._4_4_ = (float)((ulong)uStack_3ec0 >> 0x20);
      local_3698 = local_3668 + (float)local_36b8;
      fStack_3694 = fStack_3664 + local_36b8._4_4_;
      fStack_3690 = fStack_3660 + (float)uStack_36b0;
      fStack_368c = fStack_365c + uStack_36b0._4_4_;
      local_3688 = &local_42a8;
      local_3918 = CONCAT44(fStack_3694,local_3698);
      uStack_3910 = CONCAT44(fStack_368c,fStack_3690);
      local_3f00 = &local_4298;
      local_3f08 = &local_42a8;
      local_3f10 = local_4188;
      uVar2 = *local_4188;
      uVar3 = local_4188[1];
      local_3928._0_4_ = (float)uVar2;
      local_3928._4_4_ = (float)((ulong)uVar2 >> 0x20);
      uStack_3920._0_4_ = (float)uVar3;
      uStack_3920._4_4_ = (float)((ulong)uVar3 >> 0x20);
      local_38a8 = local_3698 + (float)local_3928;
      fStack_38a4 = fStack_3694 + local_3928._4_4_;
      fStack_38a0 = fStack_3690 + (float)uStack_3920;
      fStack_389c = fStack_368c + uStack_3920._4_4_;
      local_3890 = &local_4298;
      local_4298 = CONCAT44(fStack_38a4,local_38a8);
      uStack_4290 = CONCAT44(fStack_389c,fStack_38a0);
      local_3dc0 = (undefined8 *)(local_41a8 + (long)local_426c * 0x10);
      local_3dc8 = &local_4298;
      *local_3dc0 = local_4298;
      local_3dc0[1] = uStack_4290;
      local_3ea0 = local_3fd8;
      local_3c18 = local_3e98;
      local_39f8 = local_3fdc;
      local_39f4 = local_3fe0;
      local_39f0 = local_3fe4;
      local_3988 = local_41b8;
      uStack_3980 = uStack_41b0;
      local_3928 = uVar2;
      uStack_3920 = uVar3;
      local_38f0 = local_3c00;
      local_3808 = local_3bd4;
      fStack_3804 = local_3bd4;
      fStack_3800 = local_3bd4;
      fStack_37fc = local_3bd4;
      local_37ec = local_3bd4;
      local_37e8 = local_3be4;
      fStack_37e4 = local_3be4;
      fStack_37e0 = local_3be4;
      fStack_37dc = local_3be4;
      local_37cc = local_3be4;
      local_37c8 = local_3bf4;
      fStack_37c4 = local_3bf4;
      fStack_37c0 = local_3bf4;
      fStack_37bc = local_3bf4;
      local_37b8 = local_3bf4;
      local_36e8 = local_3e98;
      local_36d0 = local_36f0;
      local_36b8 = local_3ec8;
      uStack_36b0 = uStack_3ec0;
      local_3680 = local_3e98;
      local_3678 = local_36e0;
      local_3648 = local_42e8;
      uStack_3640 = uStack_42e0;
      local_35f0 = local_3610;
      local_35d8 = local_3ee8;
      uStack_35d0 = uStack_3ee0;
      local_35a0 = local_3608;
      local_3598 = local_3600;
      local_3568 = local_42d8;
      uStack_3560 = uStack_42d0;
      local_3510 = local_3530;
      local_34f8 = local_42b8;
      uStack_34f0 = uStack_42b0;
      local_34c0 = local_3528;
      local_34b8 = local_3520;
      local_3488 = local_42c8;
      uStack_3480 = uStack_42c0;
      local_3430 = local_3c28;
      local_3428 = local_3c20;
      local_20b8 = local_3c20;
      local_2078 = local_2084;
      fStack_2074 = local_2084;
      fStack_2070 = local_2084;
      fStack_206c = local_2084;
      local_205c = local_2084;
      local_2058 = local_2094;
      fStack_2054 = local_2094;
      fStack_2050 = local_2094;
      fStack_204c = local_2094;
      local_203c = local_2094;
      local_2038 = local_20a4;
      fStack_2034 = local_20a4;
      fStack_2030 = local_20a4;
      fStack_202c = local_20a4;
      local_2024 = local_20a4;
      local_2018 = local_2080;
      local_1ff0 = local_2010;
      local_1fa8 = local_3c20;
      local_1fa0 = local_20a0;
      local_1f98 = local_20b0;
      local_1f90 = local_1fb0;
      local_1f80 = local_20b0;
      local_1f78 = local_20e8;
      uStack_1f70 = uStack_20e0;
      local_1f48 = local_20b0;
      local_1f40 = local_3c20;
      local_1f38 = local_20a0;
      local_1f30 = local_1f88;
      local_1f10 = local_1f88;
      local_1ed0 = local_2010;
      local_1ec0 = local_2090;
      local_1eb8 = local_1fb0;
      local_1eb0 = local_2010;
      local_1ea0 = local_1fb0;
      local_1e98 = local_2108;
      uStack_1e90 = uStack_2100;
      local_1e68 = local_1fb0;
      local_1e60 = local_1ec8;
      local_1e58 = local_2090;
      local_1e50 = local_1ea8;
      local_1e30 = local_1ea8;
      local_1da8 = local_3c20;
      local_1d68 = local_1d74;
      fStack_1d64 = local_1d74;
      fStack_1d60 = local_1d74;
      fStack_1d5c = local_1d74;
      local_1d4c = local_1d74;
      local_1d48 = local_1d84;
      fStack_1d44 = local_1d84;
      fStack_1d40 = local_1d84;
      fStack_1d3c = local_1d84;
      local_1d2c = local_1d84;
      local_1d28 = local_1d94;
      fStack_1d24 = local_1d94;
      fStack_1d20 = local_1d94;
      fStack_1d1c = local_1d94;
      local_1d14 = local_1d94;
      local_1d08 = local_1d70;
      local_1ce0 = local_1d00;
      local_1c98 = local_3c20;
      local_1c90 = local_1d90;
      local_1c88 = local_1da0;
      local_1c80 = local_1ca0;
      local_1c70 = local_1da0;
      local_1c68 = local_1dd8;
      uStack_1c60 = uStack_1dd0;
      local_1c38 = local_1da0;
      local_1c30 = local_3c20;
      local_1c28 = local_1d90;
      local_1c20 = local_1c78;
      local_1c00 = local_1c78;
      local_1bc0 = local_1d00;
      local_1bb0 = local_1d80;
      local_1ba8 = local_1ca0;
      local_1ba0 = local_1d00;
      local_1b90 = local_1ca0;
      local_1b88 = local_1df8;
      uStack_1b80 = uStack_1df0;
      local_1b58 = local_1ca0;
      local_1b50 = local_1bb8;
      local_1b48 = local_1d80;
      local_1b40 = local_1b98;
      local_1b20 = local_1b98;
      local_1aa0 = local_3c28;
      local_1a98 = local_3c20;
      local_1a58 = local_1a64;
      fStack_1a54 = local_1a64;
      fStack_1a50 = local_1a64;
      fStack_1a4c = local_1a64;
      local_1a3c = local_1a64;
      local_1a38 = local_1a74;
      fStack_1a34 = local_1a74;
      fStack_1a30 = local_1a74;
      fStack_1a2c = local_1a74;
      local_1a1c = local_1a74;
      local_1a18 = local_1a84;
      uStack_1a14 = local_1a84;
      uStack_1a10 = local_1a84;
      uStack_1a0c = local_1a84;
      local_1a04 = local_1a84;
      local_19f8 = local_1a60;
      local_19d0 = local_19f0;
      local_19c8 = local_41c8;
      uStack_19c0 = uStack_41c0;
      local_1988 = local_3c20;
      local_1980 = local_1a80;
      local_1978 = local_1a90;
      local_1970 = local_1990;
      local_1960 = local_1a90;
      local_1958 = local_1ac8;
      uStack_1950 = uStack_1ac0;
      local_1928 = local_1a90;
      local_1920 = local_3c20;
      local_1918 = local_1a80;
      local_1910 = local_1968;
      local_18f0 = local_1968;
      local_18e8 = local_41f8[2];
      uStack_18e0 = uStack_41e0;
      local_18b0 = local_19f0;
      local_18a0 = local_1a70;
      local_1898 = local_1990;
      local_1890 = local_19f0;
      local_1880 = local_1990;
      local_1878 = local_1ae8;
      uStack_1870 = uStack_1ae0;
      local_1848 = local_1990;
      local_1840 = local_18a8;
      local_1838 = local_1a70;
      local_1830 = local_1888;
      local_1810 = local_1888;
      local_1808 = local_41d8;
      uStack_1800 = uStack_41d0;
      local_1788 = local_3c20;
      local_1780 = local_3c08;
      local_1748 = local_1754;
      fStack_1744 = local_1754;
      fStack_1740 = local_1754;
      fStack_173c = local_1754;
      local_172c = local_1754;
      local_1728 = local_1764;
      fStack_1724 = local_1764;
      fStack_1720 = local_1764;
      fStack_171c = local_1764;
      local_170c = local_1764;
      local_1708 = local_1774;
      fStack_1704 = local_1774;
      fStack_1700 = local_1774;
      fStack_16fc = local_1774;
      local_16f4 = local_1774;
      local_16e8 = local_1750;
      local_16c0 = local_16e0;
      local_1678 = local_3c20;
      local_1670 = local_1770;
      local_1668 = local_3c08;
      local_1660 = local_1680;
      local_1650 = local_3c08;
      local_1648 = local_17b8;
      uStack_1640 = uStack_17b0;
      local_1618 = local_3c08;
      local_1610 = local_3c20;
      local_1608 = local_1770;
      local_1600 = local_1658;
      local_15e0 = local_1658;
      local_15a0 = local_16e0;
      local_1590 = local_1760;
      local_1588 = local_1680;
      local_1580 = local_16e0;
      local_1570 = local_1680;
      local_1568 = local_17d8;
      uStack_1560 = uStack_17d0;
      local_1538 = local_1680;
      local_1530 = local_1598;
      local_1528 = local_1760;
      local_1520 = local_1578;
      local_1500 = local_1578;
      local_e88 = local_3c00;
      local_e80 = local_3420;
      local_e78 = local_3e98;
      local_e00 = local_20b0;
      local_df8 = local_1da0;
      local_df0 = local_1a90;
      local_de8 = local_3420;
      local_de0 = local_20b0;
      local_dd0 = local_1da0;
      local_dc0 = local_1a90;
      local_db8 = local_3420;
      local_d30 = local_3c00;
      local_c50 = local_3420;
      local_c48 = local_3e98;
      local_c20 = local_3420;
      local_c18 = local_3e98;
      local_c10 = local_3e98;
      local_c08 = local_c28;
      local_c00 = local_c38;
      local_42e8 = local_3c58;
      uStack_42e0 = uStack_3c50;
      local_42d8 = local_3c48;
      uStack_42d0 = uStack_3c40;
      local_42c8 = local_3c38;
      uStack_42c0 = uStack_3c30;
      local_42b8 = local_3c68;
      uStack_42b0 = uStack_3c60;
      local_42a8 = local_3918;
      uStack_42a0 = uStack_3910;
      local_4288 = local_3a08;
      uStack_4280 = uStack_3a00;
      local_3ef8 = local_3478;
      uStack_3ef0 = uStack_3470;
      local_3ee8 = CONCAT44(fStack_34d4,local_34d8);
      uStack_3ee0 = CONCAT44(fStack_34cc,fStack_34d0);
      local_3ed8 = local_3558;
      uStack_3ed0 = uStack_3550;
      local_3ec8 = CONCAT44(fStack_35b4,local_35b8);
      uStack_3ec0 = CONCAT44(fStack_35ac,fStack_35b0);
      local_3eb8 = local_3638;
      uStack_3eb0 = uStack_3630;
      local_3c78 = local_3978;
      uStack_3c70 = uStack_3970;
      local_3c68 = CONCAT44(fStack_3904,local_3908);
      uStack_3c60 = CONCAT44(fStack_38fc,fStack_3900);
      local_3c48 = local_3458;
      uStack_3c40 = uStack_3450;
      local_3c38 = local_3468;
      uStack_3c30 = uStack_3460;
      local_3708 = local_36a8;
      uStack_3700 = uStack_36a0;
      local_3628 = local_35c8;
      uStack_3620 = uStack_35c0;
      local_3548 = local_34e8;
      uStack_3540 = uStack_34e0;
      local_3468 = CONCAT44(fStack_1f54,local_1f58);
      uStack_3460 = CONCAT44(fStack_1f4c,fStack_1f50);
      local_3458 = CONCAT44(fStack_1c44,local_1c48);
      uStack_3450 = CONCAT44(fStack_1c3c,fStack_1c40);
      local_3448 = local_3c58;
      uStack_3440 = uStack_3c50;
      local_2118 = local_1fd8;
      uStack_2110 = uStack_1fd0;
      local_2108 = CONCAT44(fStack_2004,local_2008);
      uStack_2100 = CONCAT44(fStack_1ffc,fStack_2000);
      local_20f8 = local_1e18;
      uStack_20f0 = uStack_1e10;
      local_20e8 = CONCAT44(fStack_1e74,local_1e78);
      uStack_20e0 = CONCAT44(fStack_1e6c,fStack_1e70);
      local_20d8 = local_1ef8;
      uStack_20d0 = uStack_1ef0;
      local_1fc8 = local_1f68;
      uStack_1fc0 = uStack_1f60;
      local_1ee8 = local_1e88;
      uStack_1ee0 = uStack_1e80;
      local_1e08 = local_1cc8;
      uStack_1e00 = uStack_1cc0;
      local_1df8 = CONCAT44(fStack_1cf4,local_1cf8);
      uStack_1df0 = CONCAT44(fStack_1cec,fStack_1cf0);
      local_1de8 = local_1b08;
      uStack_1de0 = uStack_1b00;
      local_1dd8 = CONCAT44(fStack_1b64,local_1b68);
      uStack_1dd0 = CONCAT44(fStack_1b5c,fStack_1b60);
      local_1dc8 = local_1be8;
      uStack_1dc0 = uStack_1be0;
      local_1cb8 = local_1c58;
      uStack_1cb0 = uStack_1c50;
      local_1bd8 = local_1b78;
      uStack_1bd0 = uStack_1b70;
      local_1af8 = local_19b8;
      uStack_1af0 = uStack_19b0;
      local_1ae8 = CONCAT44(fStack_19e4,local_19e8);
      uStack_1ae0 = CONCAT44(fStack_19dc,fStack_19e0);
      local_1ad8 = local_17f8;
      uStack_1ad0 = uStack_17f0;
      local_1ac8 = CONCAT44(fStack_1854,local_1858);
      uStack_1ac0 = CONCAT44(fStack_184c,fStack_1850);
      local_1ab8 = local_18d8;
      uStack_1ab0 = uStack_18d0;
      local_19a8 = local_1948;
      uStack_19a0 = uStack_1940;
      local_18c8 = local_1868;
      uStack_18c0 = uStack_1860;
      local_17e8 = local_16a8;
      uStack_17e0 = uStack_16a0;
      local_17d8 = CONCAT44(fStack_16d4,local_16d8);
      uStack_17d0 = CONCAT44(fStack_16cc,fStack_16d0);
      local_17c8 = local_14e8;
      uStack_17c0 = uStack_14e0;
      local_17b8 = CONCAT44(fStack_1544,local_1548);
      uStack_17b0 = CONCAT44(fStack_153c,fStack_1540);
      local_17a8 = local_15c8;
      uStack_17a0 = uStack_15c0;
      local_1698 = local_1638;
      uStack_1690 = uStack_1630;
      local_15b8 = local_1558;
      uStack_15b0 = uStack_1550;
    }
    local_3d88 = local_3ff0;
    local_3d18 = puVar1;
    local_3ca8 = &local_4128;
    local_3ca0 = &local_40d8;
    local_3c98 = local_3d20;
    local_3b50 = local_3d28;
    local_3968 = local_40a8;
    uStack_3960 = uStack_40a0;
    local_3948 = local_4068;
    uStack_3940 = uStack_4060;
    local_38d0 = local_3c80;
    local_38b0 = local_3d00;
    local_3790 = local_3b58;
    local_3770 = local_3b58;
    local_3768 = local_37a8;
    uStack_3760 = uStack_37a0;
    local_3748 = local_37a8;
    uStack_3740 = uStack_37a0;
    local_3728 = local_37a8;
    uStack_3720 = uStack_37a0;
    local_33e0 = &local_4128;
    local_33d8 = &local_40d8;
    local_3390 = local_3d28;
    local_3388 = local_3d20;
    local_3318 = local_3d20;
    local_32d8 = local_32e4;
    fStack_32d4 = local_32e4;
    fStack_32d0 = local_32e4;
    fStack_32cc = local_32e4;
    local_32bc = local_32e4;
    local_32b8 = local_32f4;
    fStack_32b4 = local_32f4;
    fStack_32b0 = local_32f4;
    fStack_32ac = local_32f4;
    local_329c = local_32f4;
    local_3298 = local_3304;
    fStack_3294 = local_3304;
    fStack_3290 = local_3304;
    fStack_328c = local_3304;
    local_3284 = local_3304;
    local_3278 = local_32e0;
    local_3250 = local_3270;
    local_3208 = local_3d20;
    local_3200 = local_3300;
    local_31f8 = local_3310;
    local_31f0 = local_3210;
    local_31e0 = local_3310;
    local_31d8 = local_3348;
    uStack_31d0 = uStack_3340;
    local_31a8 = local_3310;
    local_31a0 = local_3d20;
    local_3198 = local_3300;
    local_3190 = local_31e8;
    local_3170 = local_31e8;
    local_3130 = local_3270;
    local_3120 = local_32f0;
    local_3118 = local_3210;
    local_3110 = local_3270;
    local_3100 = local_3210;
    local_30f8 = local_3368;
    uStack_30f0 = uStack_3360;
    local_30c8 = local_3210;
    local_30c0 = local_3128;
    local_30b8 = local_32f0;
    local_30b0 = local_3108;
    local_3090 = local_3108;
    local_3008 = local_3d20;
    local_2fc8 = local_2fd4;
    fStack_2fc4 = local_2fd4;
    fStack_2fc0 = local_2fd4;
    fStack_2fbc = local_2fd4;
    local_2fac = local_2fd4;
    local_2fa8 = local_2fe4;
    fStack_2fa4 = local_2fe4;
    fStack_2fa0 = local_2fe4;
    fStack_2f9c = local_2fe4;
    local_2f8c = local_2fe4;
    local_2f88 = local_2ff4;
    fStack_2f84 = local_2ff4;
    fStack_2f80 = local_2ff4;
    fStack_2f7c = local_2ff4;
    local_2f74 = local_2ff4;
    local_2f68 = local_2fd0;
    local_2f40 = local_2f60;
    local_2ef8 = local_3d20;
    local_2ef0 = local_2ff0;
    local_2ee8 = local_3000;
    local_2ee0 = local_2f00;
    local_2ed0 = local_3000;
    local_2ec8 = local_3038;
    uStack_2ec0 = uStack_3030;
    local_2e98 = local_3000;
    local_2e90 = local_3d20;
    local_2e88 = local_2ff0;
    local_2e80 = local_2ed8;
    local_2e60 = local_2ed8;
    local_2e20 = local_2f60;
    local_2e10 = local_2fe0;
    local_2e08 = local_2f00;
    local_2e00 = local_2f60;
    local_2df0 = local_2f00;
    local_2de8 = local_3058;
    uStack_2de0 = uStack_3050;
    local_2db8 = local_2f00;
    local_2db0 = local_2e18;
    local_2da8 = local_2fe0;
    local_2da0 = local_2df8;
    local_2d80 = local_2df8;
    local_2d00 = local_3d28;
    local_2cf8 = local_3d20;
    local_2cb8 = local_2cc4;
    fStack_2cb4 = local_2cc4;
    fStack_2cb0 = local_2cc4;
    fStack_2cac = local_2cc4;
    local_2c9c = local_2cc4;
    local_2c98 = local_2cd4;
    fStack_2c94 = local_2cd4;
    fStack_2c90 = local_2cd4;
    fStack_2c8c = local_2cd4;
    local_2c7c = local_2cd4;
    local_2c78 = local_2ce4;
    uStack_2c74 = local_2ce4;
    uStack_2c70 = local_2ce4;
    uStack_2c6c = local_2ce4;
    local_2c64 = local_2ce4;
    local_2c58 = local_2cc0;
    local_2c30 = local_2c50;
    local_2c28 = local_4078;
    uStack_2c20 = uStack_4070;
    local_2be8 = local_3d20;
    local_2be0 = local_2ce0;
    local_2bd8 = local_2cf0;
    local_2bd0 = local_2bf0;
    local_2bc0 = local_2cf0;
    local_2bb8 = local_2d28;
    uStack_2bb0 = uStack_2d20;
    local_2b88 = local_2cf0;
    local_2b80 = local_3d20;
    local_2b78 = local_2ce0;
    local_2b70 = local_2bc8;
    local_2b50 = local_2bc8;
    local_2b48 = local_4098;
    uStack_2b40 = uStack_4090;
    local_2b10 = local_2c50;
    local_2b00 = local_2cd0;
    local_2af8 = local_2bf0;
    local_2af0 = local_2c50;
    local_2ae0 = local_2bf0;
    local_2ad8 = local_2d48;
    uStack_2ad0 = uStack_2d40;
    local_2aa8 = local_2bf0;
    local_2aa0 = local_2b08;
    local_2a98 = local_2cd0;
    local_2a90 = local_2ae8;
    local_2a70 = local_2ae8;
    local_2a68 = local_4088;
    uStack_2a60 = uStack_4080;
    local_29e8 = &local_40d8;
    local_29a8 = local_29b4;
    fStack_29a4 = local_29b4;
    fStack_29a0 = local_29b4;
    fStack_299c = local_29b4;
    local_298c = local_29b4;
    local_2988 = local_29c4;
    fStack_2984 = local_29c4;
    fStack_2980 = local_29c4;
    fStack_297c = local_29c4;
    local_296c = local_29c4;
    local_2968 = local_29d4;
    fStack_2964 = local_29d4;
    fStack_2960 = local_29d4;
    fStack_295c = local_29d4;
    local_2954 = local_29d4;
    local_2948 = local_29b0;
    local_2920 = local_2940;
    local_28d8 = &local_40d8;
    local_28d0 = local_29d0;
    local_28c8 = local_29e0;
    local_28c0 = local_28e0;
    local_28b0 = local_29e0;
    local_28a8 = local_2a18;
    uStack_28a0 = uStack_2a10;
    local_2878 = local_29e0;
    local_2870 = &local_40d8;
    local_2868 = local_29d0;
    local_2860 = local_28b8;
    local_2840 = local_28b8;
    local_2800 = local_2940;
    local_27f0 = local_29c0;
    local_27e8 = local_28e0;
    local_27e0 = local_2940;
    local_27d0 = local_28e0;
    local_27c8 = local_2a38;
    uStack_27c0 = uStack_2a30;
    local_2798 = local_28e0;
    local_2790 = local_27f8;
    local_2788 = local_29c0;
    local_2780 = local_27d8;
    local_2760 = local_27d8;
    local_26d8 = &local_40d8;
    local_2698 = local_26a4;
    fStack_2694 = local_26a4;
    fStack_2690 = local_26a4;
    fStack_268c = local_26a4;
    local_267c = local_26a4;
    local_2678 = local_26b4;
    fStack_2674 = local_26b4;
    fStack_2670 = local_26b4;
    fStack_266c = local_26b4;
    local_265c = local_26b4;
    local_2658 = local_26c4;
    fStack_2654 = local_26c4;
    fStack_2650 = local_26c4;
    fStack_264c = local_26c4;
    local_2644 = local_26c4;
    local_2638 = local_26a0;
    local_2610 = local_2630;
    local_25c8 = &local_40d8;
    local_25c0 = local_26c0;
    local_25b8 = local_26d0;
    local_25b0 = local_25d0;
    local_25a0 = local_26d0;
    local_2598 = local_2708;
    uStack_2590 = uStack_2700;
    local_2568 = local_26d0;
    local_2560 = &local_40d8;
    local_2558 = local_26c0;
    local_2550 = local_25a8;
    local_2530 = local_25a8;
    local_24f0 = local_2630;
    local_24e0 = local_26b0;
    local_24d8 = local_25d0;
    local_24d0 = local_2630;
    local_24c0 = local_25d0;
    local_24b8 = local_2728;
    uStack_24b0 = uStack_2720;
    local_2488 = local_25d0;
    local_2480 = local_24e8;
    local_2478 = local_26b0;
    local_2470 = local_24c8;
    local_2450 = local_24c8;
    local_23d0 = &local_4128;
    local_23c8 = &local_40d8;
    local_2388 = local_2394;
    fStack_2384 = local_2394;
    fStack_2380 = local_2394;
    fStack_237c = local_2394;
    local_236c = local_2394;
    local_2368 = local_23a4;
    fStack_2364 = local_23a4;
    fStack_2360 = local_23a4;
    fStack_235c = local_23a4;
    local_234c = local_23a4;
    local_2348 = local_23b4;
    fStack_2344 = local_23b4;
    fStack_2340 = local_23b4;
    fStack_233c = local_23b4;
    local_2334 = local_23b4;
    local_2328 = local_2390;
    local_2300 = local_2320;
    local_22f8 = local_40b8;
    uStack_22f0 = uStack_40b0;
    local_22b8 = &local_40d8;
    local_22b0 = local_23b0;
    local_22a8 = local_23c0;
    local_22a0 = local_22c0;
    local_2290 = local_23c0;
    local_2288 = local_23f8;
    uStack_2280 = uStack_23f0;
    local_2258 = local_23c0;
    local_2250 = &local_40d8;
    local_2248 = local_23b0;
    local_2240 = local_2298;
    local_2220 = local_2298;
    local_2218 = local_40d8;
    uStack_2210 = uStack_40d0;
    local_21e0 = local_2320;
    local_21d0 = local_23a0;
    local_21c8 = local_22c0;
    local_21c0 = local_2320;
    local_21b0 = local_22c0;
    local_21a8 = local_2418;
    uStack_21a0 = uStack_2410;
    local_2178 = local_22c0;
    local_2170 = local_21d8;
    local_2168 = local_23a0;
    local_2160 = local_21b8;
    local_2140 = local_21b8;
    local_2138 = local_40c8;
    uStack_2130 = uStack_40c0;
    local_1478 = &local_40d8;
    local_1470 = local_3c88;
    local_1438 = local_1444;
    fStack_1434 = local_1444;
    fStack_1430 = local_1444;
    fStack_142c = local_1444;
    local_141c = local_1444;
    local_1418 = local_1454;
    fStack_1414 = local_1454;
    fStack_1410 = local_1454;
    fStack_140c = local_1454;
    local_13fc = local_1454;
    local_13f8 = local_1464;
    fStack_13f4 = local_1464;
    fStack_13f0 = local_1464;
    fStack_13ec = local_1464;
    local_13e4 = local_1464;
    local_13d8 = local_1440;
    local_13b0 = local_13d0;
    local_1368 = &local_40d8;
    local_1360 = local_1460;
    local_1358 = local_3c88;
    local_1350 = local_1370;
    local_1340 = local_3c88;
    local_1338 = local_14a8;
    uStack_1330 = uStack_14a0;
    local_1308 = local_3c88;
    local_1300 = &local_40d8;
    local_12f8 = local_1460;
    local_12f0 = local_1348;
    local_12d0 = local_1348;
    local_1290 = local_13d0;
    local_1280 = local_1450;
    local_1278 = local_1370;
    local_1270 = local_13d0;
    local_1260 = local_1370;
    local_1258 = local_14c8;
    uStack_1250 = uStack_14c0;
    local_1228 = local_1370;
    local_1220 = local_1288;
    local_1218 = local_1450;
    local_1210 = local_1268;
    local_11f0 = local_1268;
    local_1168 = local_3d20;
    local_1160 = local_3d08;
    local_1128 = local_1134;
    fStack_1124 = local_1134;
    fStack_1120 = local_1134;
    fStack_111c = local_1134;
    local_110c = local_1134;
    local_1108 = local_1144;
    fStack_1104 = local_1144;
    fStack_1100 = local_1144;
    fStack_10fc = local_1144;
    local_10ec = local_1144;
    local_10e8 = local_1154;
    fStack_10e4 = local_1154;
    fStack_10e0 = local_1154;
    fStack_10dc = local_1154;
    local_10d4 = local_1154;
    local_10c8 = local_1130;
    local_10a0 = local_10c0;
    local_1058 = local_3d20;
    local_1050 = local_1150;
    local_1048 = local_3d08;
    local_1040 = local_1060;
    local_1030 = local_3d08;
    local_1028 = local_1198;
    uStack_1020 = uStack_1190;
    local_ff8 = local_3d08;
    local_ff0 = local_3d20;
    local_fe8 = local_1150;
    local_fe0 = local_1038;
    local_fc0 = local_1038;
    local_f80 = local_10c0;
    local_f70 = local_1140;
    local_f68 = local_1060;
    local_f60 = local_10c0;
    local_f50 = local_1060;
    local_f48 = local_11b8;
    uStack_f40 = uStack_11b0;
    local_f18 = local_1060;
    local_f10 = local_f78;
    local_f08 = local_1140;
    local_f00 = local_f58;
    local_ee0 = local_f58;
    local_ea0 = local_3b58;
    local_e90 = local_3d28;
    local_e70 = local_3c80;
    local_e68 = local_33d0;
    local_e60 = local_3d20;
    local_e58 = local_3d00;
    local_e50 = local_3380;
    local_e48 = puVar1;
    local_e40 = local_3310;
    local_e38 = local_3000;
    local_e30 = local_2cf0;
    local_e28 = local_3380;
    local_e20 = local_29e0;
    local_e18 = local_26d0;
    local_e10 = local_23c0;
    local_e08 = local_33d0;
    local_db0 = local_29e0;
    local_da0 = local_26d0;
    local_d90 = local_23c0;
    local_d88 = local_33d0;
    local_d80 = local_3310;
    local_d70 = local_3000;
    local_d60 = local_2cf0;
    local_d58 = local_3380;
    local_d50 = local_3d00;
    local_d40 = local_3c80;
    local_d20 = local_3b58;
    local_d00 = local_3380;
    local_cf8 = puVar1;
    local_cd0 = local_3380;
    local_cc8 = puVar1;
    local_cc0 = puVar1;
    local_cb8 = local_cd8;
    local_cb0 = local_ce8;
    local_ca8 = local_33d0;
    local_ca0 = local_3d20;
    local_c78 = local_33d0;
    local_c70 = local_3d20;
    local_c68 = local_3d20;
    local_c60 = local_c80;
    local_c58 = local_c90;
    local_bf8 = local_e98;
    local_bf0 = local_3d28;
    local_bc8 = local_e98;
    local_bc0 = local_3d28;
    local_bb8 = local_3d28;
    local_bb0 = local_bd0;
    local_ba8 = local_be0;
    local_ad4 = fStack_aa0 * fStack_aa0 + (1.0 - fStack_aa0 * fStack_aa0) * local_ab0;
    local_ad0 = fStack_aa4 * fStack_aa0 * (1.0 - local_ab0) + local_aa8 * local_aac;
    local_ac8 = fStack_aa4 * fStack_aa0 * (1.0 - local_ab0) - local_aa8 * local_aac;
    local_ac4 = fStack_aa4 * fStack_aa4 + (1.0 - fStack_aa4 * fStack_aa4) * local_ab0;
    local_abc = local_aa8 * fStack_aa0 * (1.0 - local_ab0) + fStack_aa4 * local_aac;
    local_ab8 = local_aa8 * fStack_aa4 * (1.0 - local_ab0) - fStack_aa0 * local_aac;
    local_ab4 = local_23b4;
    local_590 = &local_b28;
    local_588 = &local_4128;
    local_570 = local_578;
    local_550 = local_3d80;
    local_4e8 = &local_b28;
    local_4dc = local_acc;
    local_4d8 = local_ac0;
    local_4d4 = local_23b4;
    local_4d0 = &local_b28;
    local_488 = local_4a4;
    local_484 = local_4a8;
    local_480 = local_4ac;
    local_468 = local_4bc;
    local_464 = local_4c0;
    local_460 = local_4c4;
    local_448 = local_23b4;
    local_444 = local_ac0;
    local_440 = local_acc;
    local_438 = local_3d80;
    local_430 = local_3d80;
    local_418 = &local_4128;
    local_410 = &local_4128;
    local_3f8 = local_558;
    local_3f0 = local_3d80;
    local_3c8 = local_558;
    local_3c0 = local_3d80;
    local_3b8 = &local_b28;
    local_3b0 = &local_4128;
    local_388 = &local_b28;
    local_380 = &local_4128;
    local_370 = local_580;
    local_330 = local_3ff0;
    local_328 = local_558;
    local_2e0 = local_3ff0;
    local_2d8 = local_558;
    local_2c0 = local_558;
    local_278 = local_294;
    local_274 = local_298;
    local_270 = local_29c;
    local_258 = local_2ac;
    local_254 = local_2b0;
    local_250 = local_2b4;
    local_238 = local_2c4;
    local_234 = local_2c8;
    local_230 = local_2cc;
    local_178 = local_e98;
    local_160 = local_e98;
    local_4258 = local_248;
    uStack_4250 = uStack_240;
    local_4248 = local_3da8;
    uStack_4240 = uStack_3da0;
    local_4238 = local_3d98;
    uStack_4230 = uStack_3d90;
    local_4228 = 0;
    uStack_4220 = 0;
    local_41f8[2] = local_3d58;
    uStack_41e0 = uStack_3d50;
    local_41d8 = local_3d48;
    uStack_41d0 = uStack_3d40;
    local_41c8 = local_3d38;
    uStack_41c0 = uStack_3d30;
    local_41b8 = local_3d68;
    uStack_41b0 = uStack_3d60;
    local_4178 = local_3788;
    uStack_4170 = uStack_3780;
    local_4168 = 0x3f800000;
    uStack_4160 = 0;
    local_4158 = 0x3f80000000000000;
    uStack_4150 = 0;
    local_4148 = 0;
    uStack_4140 = 0x3f800000;
    local_4138 = local_4178;
    uStack_4130 = uStack_4170;
    local_4128 = local_458;
    uStack_4120 = uStack_450;
    local_4118 = local_b18;
    uStack_4110 = uStack_b10;
    local_4108 = local_b08;
    uStack_4100 = uStack_b00;
    local_40f8 = 0;
    uStack_40f0 = 0;
    local_4098 = local_3cd8;
    uStack_4090 = uStack_3cd0;
    local_4088 = local_3cc8;
    uStack_4080 = uStack_3cc0;
    local_4078 = local_3cb8;
    uStack_4070 = uStack_3cb0;
    local_4068 = local_3ce8;
    uStack_4060 = uStack_3ce0;
    local_3db8 = local_248;
    uStack_3db0 = uStack_240;
    local_3da8 = local_268;
    uStack_3da0 = uStack_260;
    local_3d98 = local_288;
    uStack_3d90 = uStack_280;
    local_3d78 = local_3938;
    uStack_3d70 = uStack_3930;
    local_3d68 = CONCAT44(fStack_38c4,local_38c8);
    uStack_3d60 = CONCAT44(fStack_38bc,fStack_38c0);
    local_3d48 = local_33b8;
    uStack_3d40 = uStack_33b0;
    local_3d38 = local_33c8;
    uStack_3d30 = uStack_33c0;
    local_3cf8 = local_3958;
    uStack_3cf0 = uStack_3950;
    local_3ce8 = CONCAT44(fStack_38e4,local_38e8);
    uStack_3ce0 = CONCAT44(fStack_38dc,fStack_38e0);
    local_3cc8 = local_3408;
    uStack_3cc0 = uStack_3400;
    local_3cb8 = local_3418;
    uStack_3cb0 = uStack_3410;
    local_3418 = CONCAT44(fStack_2884,local_2888);
    uStack_3410 = CONCAT44(fStack_287c,fStack_2880);
    local_3408 = CONCAT44(fStack_2574,local_2578);
    uStack_3400 = CONCAT44(fStack_256c,fStack_2570);
    local_33f8 = local_3cd8;
    uStack_33f0 = uStack_3cd0;
    local_33c8 = CONCAT44(fStack_31b4,local_31b8);
    uStack_33c0 = CONCAT44(fStack_31ac,fStack_31b0);
    local_33b8 = CONCAT44(fStack_2ea4,local_2ea8);
    uStack_33b0 = CONCAT44(fStack_2e9c,fStack_2ea0);
    local_33a8 = local_3d58;
    uStack_33a0 = uStack_3d50;
    local_3378 = local_3238;
    uStack_3370 = uStack_3230;
    local_3368 = CONCAT44(fStack_3264,local_3268);
    uStack_3360 = CONCAT44(fStack_325c,fStack_3260);
    local_3358 = local_3078;
    uStack_3350 = uStack_3070;
    local_3348 = CONCAT44(fStack_30d4,local_30d8);
    uStack_3340 = CONCAT44(fStack_30cc,fStack_30d0);
    local_3338 = local_3158;
    uStack_3330 = uStack_3150;
    local_3228 = local_31c8;
    uStack_3220 = uStack_31c0;
    local_3148 = local_30e8;
    uStack_3140 = uStack_30e0;
    local_3068 = local_2f28;
    uStack_3060 = uStack_2f20;
    local_3058 = CONCAT44(fStack_2f54,local_2f58);
    uStack_3050 = CONCAT44(fStack_2f4c,fStack_2f50);
    local_3048 = local_2d68;
    uStack_3040 = uStack_2d60;
    local_3038 = CONCAT44(fStack_2dc4,local_2dc8);
    uStack_3030 = CONCAT44(fStack_2dbc,fStack_2dc0);
    local_3028 = local_2e48;
    uStack_3020 = uStack_2e40;
    local_2f18 = local_2eb8;
    uStack_2f10 = uStack_2eb0;
    local_2e38 = local_2dd8;
    uStack_2e30 = uStack_2dd0;
    local_2d58 = local_2c18;
    uStack_2d50 = uStack_2c10;
    local_2d48 = CONCAT44(fStack_2c44,local_2c48);
    uStack_2d40 = CONCAT44(fStack_2c3c,fStack_2c40);
    local_2d38 = local_2a58;
    uStack_2d30 = uStack_2a50;
    local_2d28 = CONCAT44(fStack_2ab4,local_2ab8);
    uStack_2d20 = CONCAT44(fStack_2aac,fStack_2ab0);
    local_2d18 = local_2b38;
    uStack_2d10 = uStack_2b30;
    local_2c08 = local_2ba8;
    uStack_2c00 = uStack_2ba0;
    local_2b28 = local_2ac8;
    uStack_2b20 = uStack_2ac0;
    local_2a48 = local_2908;
    uStack_2a40 = uStack_2900;
    local_2a38 = CONCAT44(fStack_2934,local_2938);
    uStack_2a30 = CONCAT44(fStack_292c,fStack_2930);
    local_2a28 = local_2748;
    uStack_2a20 = uStack_2740;
    local_2a18 = CONCAT44(fStack_27a4,local_27a8);
    uStack_2a10 = CONCAT44(fStack_279c,fStack_27a0);
    local_2a08 = local_2828;
    uStack_2a00 = uStack_2820;
    local_28f8 = local_2898;
    uStack_28f0 = uStack_2890;
    local_2818 = local_27b8;
    uStack_2810 = uStack_27b0;
    local_2738 = local_25f8;
    uStack_2730 = uStack_25f0;
    local_2728 = CONCAT44(fStack_2624,local_2628);
    uStack_2720 = CONCAT44(fStack_261c,fStack_2620);
    local_2718 = local_2438;
    uStack_2710 = uStack_2430;
    local_2708 = CONCAT44(fStack_2494,local_2498);
    uStack_2700 = CONCAT44(fStack_248c,fStack_2490);
    local_26f8 = local_2518;
    uStack_26f0 = uStack_2510;
    local_25e8 = local_2588;
    uStack_25e0 = uStack_2580;
    local_2508 = local_24a8;
    uStack_2500 = uStack_24a0;
    local_2428 = local_22e8;
    uStack_2420 = uStack_22e0;
    local_2418 = CONCAT44(fStack_2314,local_2318);
    uStack_2410 = CONCAT44(fStack_230c,fStack_2310);
    local_2408 = local_2128;
    uStack_2400 = uStack_2120;
    local_23f8 = CONCAT44(fStack_2184,local_2188);
    uStack_23f0 = CONCAT44(fStack_217c,fStack_2180);
    local_23e8 = local_2208;
    uStack_23e0 = uStack_2200;
    local_22d8 = local_2278;
    uStack_22d0 = uStack_2270;
    local_21f8 = local_2198;
    uStack_21f0 = uStack_2190;
    local_14d8 = local_1398;
    uStack_14d0 = uStack_1390;
    local_14c8 = CONCAT44(fStack_13c4,local_13c8);
    uStack_14c0 = CONCAT44(fStack_13bc,fStack_13c0);
    local_14b8 = local_11d8;
    uStack_14b0 = uStack_11d0;
    local_14a8 = CONCAT44(fStack_1234,local_1238);
    uStack_14a0 = CONCAT44(fStack_122c,fStack_1230);
    local_1498 = local_12b8;
    uStack_1490 = uStack_12b0;
    local_1388 = local_1328;
    uStack_1380 = uStack_1320;
    local_12a8 = local_1248;
    uStack_12a0 = uStack_1240;
    local_11c8 = local_1088;
    uStack_11c0 = uStack_1080;
    local_11b8 = CONCAT44(fStack_10b4,local_10b8);
    uStack_11b0 = CONCAT44(fStack_10ac,fStack_10b0);
    local_11a8 = local_ec8;
    uStack_11a0 = uStack_ec0;
    local_1198 = CONCAT44(fStack_f24,local_f28);
    uStack_1190 = CONCAT44(fStack_f1c,fStack_f20);
    local_1188 = local_fa8;
    uStack_1180 = uStack_fa0;
    local_1078 = local_1018;
    uStack_1070 = uStack_1010;
    local_f98 = local_f38;
    uStack_f90 = uStack_f30;
    local_b28 = local_458;
    uStack_b20 = uStack_450;
    local_b18 = local_478;
    uStack_b10 = uStack_470;
    local_b08 = local_498;
    uStack_b00 = uStack_490;
  }
  local_3fc0 = &local_42f8;
  local_3fc4 = 0x3f800000;
  local_3fc8 = 0;
  local_3fcc = 0;
  local_3a0c = 0;
  local_3a10 = 0;
  local_3a14 = 0;
  local_3a18 = 0x3f800000;
  local_3a28 = 0x3f800000;
  uStack_3a20 = 0;
  local_42f8 = 0x3f800000;
  uStack_42f0 = 0;
  local_3dd0 = _DAT_00642618;
  *_DAT_00642618 = 0x3f800000;
  puVar4[1] = 0;
  puVar4 = _DAT_00642618;
  local_3fa8 = &local_4308;
  local_3fac = 0x3f800000;
  local_3fb0 = 0;
  local_3fb4 = 0;
  local_3a2c = 0;
  local_3a30 = 0;
  local_3a34 = 0;
  local_3a38 = 0x3f800000;
  local_3a48 = 0x3f800000;
  uStack_3a40 = 0;
  local_4308 = 0x3f800000;
  uStack_4300 = 0;
  local_3de0 = _DAT_00642618 + 2;
  *local_3de0 = 0x3f800000;
  puVar4[3] = 0;
  puVar4 = _DAT_00642618;
  local_3f90 = &local_4318;
  local_3f94 = 0;
  local_3f98 = 0x3f800000;
  local_3f9c = 0;
  local_3a4c = 0;
  local_3a50 = 0;
  local_3a54 = 0x3f800000;
  local_3a58 = 0;
  local_3a68 = 0x3f80000000000000;
  uStack_3a60 = 0;
  local_4318 = 0x3f80000000000000;
  uStack_4310 = 0;
  local_3df0 = _DAT_00642618 + 4;
  *local_3df0 = 0x3f80000000000000;
  puVar4[5] = 0;
  puVar4 = _DAT_00642618;
  local_3f78 = &local_4328;
  local_3f7c = 0;
  local_3f80 = 0x3f800000;
  local_3f84 = 0;
  local_3a6c = 0;
  local_3a70 = 0;
  local_3a74 = 0x3f800000;
  local_3a78 = 0;
  local_3a88 = 0x3f80000000000000;
  uStack_3a80 = 0;
  local_4328 = 0x3f80000000000000;
  uStack_4320 = 0;
  local_3e00 = _DAT_00642618 + 6;
  *local_3e00 = 0x3f80000000000000;
  puVar4[7] = 0;
  puVar4 = _DAT_00642618;
  local_3e18 = &local_4338;
  local_3bc4 = 0x3f000000;
  local_380c = 0x3f000000;
  local_3828 = 0x3f000000;
  uStack_3824 = 0x3f000000;
  uStack_3820 = 0x3f000000;
  uStack_381c = 0x3f000000;
  local_4338 = 0x3f0000003f000000;
  uStack_4330 = 0x3f0000003f000000;
  local_3e10 = _DAT_00642618 + 8;
  *local_3e10 = 0x3f0000003f000000;
  puVar4[9] = 0x3f0000003f000000;
  puVar4 = _DAT_00642618;
  local_3e28 = &local_4348;
  local_3bb4 = 0x3f000000;
  local_382c = 0x3f000000;
  local_3848 = 0x3f000000;
  uStack_3844 = 0x3f000000;
  uStack_3840 = 0x3f000000;
  uStack_383c = 0x3f000000;
  local_4348 = 0x3f0000003f000000;
  uStack_4340 = 0x3f0000003f000000;
  local_3e20 = _DAT_00642618 + 10;
  *local_3e20 = 0x3f0000003f000000;
  puVar4[0xb] = 0x3f0000003f000000;
  puVar4 = _DAT_00642618;
  local_3e38 = &local_4358;
  local_3ba4 = 0x3f800000;
  local_384c = 0x3f800000;
  local_3868 = 0x3f800000;
  uStack_3864 = 0x3f800000;
  uStack_3860 = 0x3f800000;
  uStack_385c = 0x3f800000;
  local_4358 = 0x3f8000003f800000;
  uStack_4350 = 0x3f8000003f800000;
  local_3e30 = _DAT_00642618 + 0xc;
  *local_3e30 = 0x3f8000003f800000;
  puVar4[0xd] = 0x3f8000003f800000;
  puVar4 = _DAT_00642618;
  local_3e48 = &local_4368;
  local_3b94 = 0x3f800000;
  local_386c = 0x3f800000;
  local_3888 = 0x3f800000;
  uStack_3884 = 0x3f800000;
  uStack_3880 = 0x3f800000;
  uStack_387c = 0x3f800000;
  local_4368 = 0x3f8000003f800000;
  uStack_4360 = 0x3f8000003f800000;
  local_3e40 = _DAT_00642618 + 0xe;
  *local_3e40 = 0x3f8000003f800000;
  puVar4[0xf] = 0x3f8000003f800000;
  puVar4 = _DAT_00642618;
  local_3f60 = &local_4378;
  local_3f64 = 0;
  local_3f68 = 0;
  local_3f6c = 0x3f800000;
  local_3a8c = 0;
  local_3a90 = 0x3f800000;
  local_3a94 = 0;
  local_3a98 = 0;
  local_3aa8 = 0;
  uStack_3aa0 = 0x3f800000;
  local_4378 = 0;
  uStack_4370 = 0x3f800000;
  local_3e50 = _DAT_00642618 + 0x10;
  *local_3e50 = 0;
  puVar4[0x11] = 0x3f800000;
  puVar4 = _DAT_00642618;
  local_3f48 = &local_4388;
  local_3f4c = 0;
  local_3f50 = 0;
  local_3f54 = 0x3f800000;
  local_3aac = 0;
  local_3ab0 = 0x3f800000;
  local_3ab4 = 0;
  local_3ab8 = 0;
  local_3ac8 = 0;
  uStack_3ac0 = 0x3f800000;
  local_4388 = 0;
  uStack_4380 = 0x3f800000;
  local_3e60 = _DAT_00642618 + 0x12;
  *local_3e60 = 0;
  puVar4[0x13] = 0x3f800000;
  puVar4 = _DAT_00642618;
  local_3f30 = &local_4398;
  local_3f34 = 0x3f800000;
  local_3f38 = 0x3f800000;
  local_3f3c = 0;
  local_3acc = 0;
  local_3ad0 = 0;
  local_3ad4 = 0x3f800000;
  local_3ad8 = 0x3f800000;
  local_3ae8 = 0x3f8000003f800000;
  uStack_3ae0 = 0;
  local_4398 = 0x3f8000003f800000;
  uStack_4390 = 0;
  local_3e70 = _DAT_00642618 + 0x14;
  *local_3e70 = 0x3f8000003f800000;
  puVar4[0x15] = 0;
  puVar4 = _DAT_00642618;
  local_3f18 = &local_43a8;
  local_3f1c = 0x3f800000;
  local_3f20 = 0x3f800000;
  local_3f24 = 0;
  local_3aec = 0;
  local_3af0 = 0;
  local_3af4 = 0x3f800000;
  local_3af8 = 0x3f800000;
  local_3b08 = 0x3f8000003f800000;
  uStack_3b00 = 0;
  local_43a8 = 0x3f8000003f800000;
  uStack_43a0 = 0;
  local_3e80 = _DAT_00642618 + 0x16;
  local_3e88 = &local_43a8;
  *local_3e80 = 0x3f8000003f800000;
  puVar4[0x17] = 0;
  local_3e78 = local_3f30;
  local_3e68 = local_3f48;
  local_3e58 = local_3f60;
  local_3e08 = local_3f78;
  local_3df8 = local_3f90;
  local_3de8 = local_3fa8;
  local_3dd8 = local_3fc0;
  local_3bc0 = local_3e18;
  local_3bb0 = local_3e28;
  local_3ba0 = local_3e38;
  local_3b90 = local_3e48;
  rtcCommitGeometry(local_4198);
  uVar5 = rtcAttachGeometry(local_4180,local_4198);
  rtcReleaseGeometry(local_4198);
  return uVar5;
}

Assistant:

unsigned int addTriangleCube (RTCScene scene, const Vec3fa& pos, unsigned int num_time_steps)
{
  /* create a triangulated cube with 12 triangles and 8 vertices */
  RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);
  rtcSetGeometryTimeStepCount(geom,num_time_steps);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT3, data.cube_triangle_indices, 0, 3*sizeof(unsigned int), 12);

  for (unsigned int t=0; t<num_time_steps; t++)
  {
    RTCBufferType bufType = RTC_BUFFER_TYPE_VERTEX;
    Vec3fa* vertices = (Vec3fa*) rtcSetNewGeometryBuffer(geom,bufType,t,RTC_FORMAT_FLOAT3,sizeof(Vec3fa), 8);

    AffineSpace3fa rotation = AffineSpace3fa::rotate(Vec3fa(0,0,0),Vec3fa(0,1,0),2.0f*float(M_PI)*(float)t/(float)(num_time_steps-1));
    AffineSpace3fa scale = AffineSpace3fa::scale(Vec3fa(2.0f,1.0f,1.0f));

    for (int i=0; i<8; i++) {
      Vec3fa v = Vec3fa(cube_vertices[i][0],cube_vertices[i][1],cube_vertices[i][2]);
      vertices[i] = Vec3fa(xfmPoint(rotation*scale,v)+pos);
    }
  }

  /* create face color array */
  data.face_colors[0] = Vec3fa(1,0,0);
  data.face_colors[1] = Vec3fa(1,0,0);
  data.face_colors[2] = Vec3fa(0,1,0);
  data.face_colors[3] = Vec3fa(0,1,0);
  data.face_colors[4] = Vec3fa(0.5f);
  data.face_colors[5] = Vec3fa(0.5f);
  data.face_colors[6] = Vec3fa(1.0f);
  data.face_colors[7] = Vec3fa(1.0f);
  data.face_colors[8] = Vec3fa(0,0,1);
  data.face_colors[9] = Vec3fa(0,0,1);
  data.face_colors[10] = Vec3fa(1,1,0);
  data.face_colors[11] = Vec3fa(1,1,0);

  rtcCommitGeometry(geom);
  unsigned int geomID = rtcAttachGeometry(scene,geom);
  rtcReleaseGeometry(geom);
  return geomID;
}